

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O0

error<idx2::idx2_err_code>
idx2::TraverseFirstLevel
          (idx2_file *Idx2,params *P,decode_data *D,grid *OutGrid,mmap_volume *OutVolFile,
          volume *OutVolMem)

{
  u64 *puVar1;
  undefined1 *puVar2;
  u64 *puVar3;
  bool bVar4;
  undefined1 auVar5 [11];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  u64 uVar11;
  undefined8 uVar12;
  char Level_00;
  int iVar13;
  int iVar14;
  ulong *puVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  error<idx2::idx2_err_code> eVar19;
  v3i Brick3;
  char local_50fd;
  char local_50ed;
  char local_50d9;
  brick_traverse *local_50c0;
  char local_505d;
  char local_504d;
  char local_5039;
  chunk_traverse *local_5020;
  char local_4fed;
  char local_4fdd;
  char local_4fc9;
  file_traverse *local_4fb0;
  anon_class_1_0_00000001 local_4f89;
  undefined8 local_4f88;
  int local_4f80;
  undefined8 local_4f74;
  int local_4f6c;
  undefined8 local_4f68;
  int local_4f60;
  undefined8 local_4f54;
  int local_4f4c;
  undefined8 local_4f48;
  int local_4f40;
  undefined8 local_4f34;
  int local_4f2c;
  undefined8 local_4f28;
  int local_4f20;
  undefined8 local_4f14;
  int local_4f0c;
  undefined8 local_4f08;
  int local_4f00;
  undefined8 local_4ef8;
  int local_4ef0;
  long local_4ee8;
  long local_4ee0;
  long local_4ed8;
  undefined8 local_4ed0;
  uint local_4ec8;
  undefined8 local_4ec0;
  uint local_4eb8;
  ulong local_4eb0;
  extent Skip;
  file_traverse Second;
  file_traverse First;
  undefined8 local_4e2c;
  int local_4e24;
  undefined8 local_4e20;
  int local_4e18;
  undefined8 local_4e0c;
  int local_4e04;
  undefined8 local_4e00;
  int local_4df8;
  undefined8 local_4dec;
  int local_4de4;
  undefined8 local_4de0;
  int local_4dd8;
  undefined8 local_4dcc;
  int local_4dc4;
  undefined8 local_4dc0;
  int local_4db8;
  undefined8 local_4db0;
  int local_4da8;
  long local_4da0;
  long local_4d98;
  long local_4d90;
  undefined8 local_4d88;
  int local_4d80;
  extent local_4d78;
  undefined8 local_4d68;
  int local_4d60;
  undefined8 local_4d58;
  int local_4d50;
  extent local_4d48;
  undefined8 local_4d38;
  int local_4d30;
  long local_4d28;
  long local_4d20;
  long local_4d18;
  undefined8 local_4d10;
  uint local_4d08;
  undefined8 local_4d00;
  uint local_4cf8;
  undefined1 local_4cf0 [8];
  extent Skip_1;
  chunk_traverse Second_1;
  chunk_traverse First_1;
  undefined8 local_4c4c;
  int local_4c44;
  undefined8 local_4c40;
  int local_4c38;
  undefined8 local_4c2c;
  int local_4c24;
  undefined8 local_4c20;
  int local_4c18;
  undefined8 local_4c0c;
  int local_4c04;
  undefined8 local_4c00;
  int local_4bf8;
  undefined8 local_4bec;
  int local_4be4;
  undefined8 local_4be0;
  int local_4bd8;
  undefined8 local_4bd0;
  int local_4bc8;
  long local_4bc0;
  long local_4bb8;
  long local_4bb0;
  undefined8 local_4ba8;
  int local_4ba0;
  extent local_4b98;
  undefined8 local_4b88;
  int local_4b80;
  undefined8 local_4b78;
  int local_4b70;
  extent local_4b68;
  undefined8 local_4b58;
  int local_4b50;
  long local_4b48;
  long local_4b40;
  long local_4b38;
  undefined8 local_4b30;
  uint local_4b28;
  undefined8 local_4b20;
  uint local_4b18;
  undefined1 local_4b10 [8];
  extent Skip_2;
  brick_traverse Second_2;
  brick_traverse First_2;
  undefined1 local_49c0 [8];
  decode_state First_3;
  unique_lock<std::mutex> Lock;
  extent BrickExtentCrop;
  undefined8 local_492c;
  uint local_4924;
  undefined1 local_4920 [8];
  extent BrickExtent;
  undefined8 local_4900;
  int local_48f8;
  uint local_48f4;
  ulong *puStack_48f0;
  int DD;
  brick_traverse *Top;
  int local_48e0;
  undefined8 local_48d8;
  int local_48d0;
  undefined8 local_48c8;
  int local_48c0;
  undefined8 local_48b8;
  int local_48b0;
  unsigned_long local_48a8;
  unsigned_long local_48a0;
  undefined8 local_4898;
  int local_4890;
  brick_traverse *local_488c;
  int local_4884;
  undefined8 local_4880;
  undefined4 local_4878;
  undefined8 local_4870;
  int local_4868;
  int local_4864;
  v3i BrickDims3Ext;
  int TopIdx;
  brick_traverse Stack [64];
  undefined8 local_3840;
  int local_3838;
  uint local_3834;
  ulong *puStack_3830;
  int CD;
  chunk_traverse *ChunkTop;
  int local_3820;
  undefined8 local_3818;
  int local_3810;
  undefined8 local_3808;
  int local_3800;
  undefined8 local_37f8;
  int local_37f0;
  unsigned_long local_37e8;
  unsigned_long local_37e0;
  undefined8 local_37d8;
  int local_37d0;
  chunk_traverse *local_37cc;
  int local_37c4;
  undefined8 local_37c0;
  undefined4 local_37b8;
  undefined8 local_37b0;
  int local_37a8;
  int local_37a4;
  v3i ChunkDims3Ext;
  int ChunkTopIdx;
  chunk_traverse ChunkStack [64];
  undefined8 local_2780;
  int local_2778;
  uint local_2774;
  ulong *puStack_2770;
  int FD;
  file_traverse *FileTop;
  int local_2760;
  undefined4 local_2754;
  undefined4 local_2750;
  undefined4 local_274c;
  unsigned_long local_2748;
  unsigned_long local_2740;
  undefined4 local_2738;
  undefined4 local_2734;
  undefined4 local_2730;
  file_traverse *local_272c;
  int local_2724;
  undefined8 local_2720;
  undefined4 local_2718;
  undefined4 local_2714;
  v3i FileDims3Ext;
  int FileTopIdx;
  file_traverse FileStack [64];
  decode_state Ds;
  undefined8 local_1a88;
  int local_1a80;
  undefined8 local_1a7c;
  v3i B3;
  extent VolExtentInFiles;
  extent VolExtentInChunks;
  extent VolExtentInBricks;
  extent ExtentInFiles;
  extent ExtentInChunks;
  extent ExtentInBricks;
  i8 Level;
  volume *OutVolMem_local;
  mmap_volume *OutVolFile_local;
  grid *OutGrid_local;
  decode_data *D_local;
  params *P_local;
  idx2_file *Idx2_local;
  undefined5 uStack_19cd;
  undefined8 local_19a4;
  undefined8 local_1998;
  int local_1990;
  v3<int> *local_1988;
  ulong *local_1980;
  undefined8 local_1974;
  undefined8 local_1968;
  int local_1960;
  v3<int> *local_1958;
  ulong *local_1950;
  undefined8 local_1944;
  undefined8 local_1938;
  int local_1930;
  v3<int> *local_1928;
  ulong *local_1920;
  undefined8 local_1914;
  undefined8 local_1908;
  int local_1900;
  v3<int> *local_18f8;
  ulong *local_18f0;
  undefined8 local_18e4;
  ulong local_18d8;
  int local_18d0;
  undefined8 *local_18c8;
  v3i *local_18c0;
  undefined8 local_18b4;
  undefined8 local_18a8;
  int local_18a0;
  int local_1878;
  int local_1874;
  int I;
  undefined8 local_1864;
  v3i Result;
  undefined8 local_1838;
  undefined4 local_182c;
  undefined8 *local_1828;
  undefined4 local_181c;
  undefined4 *local_1818;
  undefined4 local_180c;
  undefined4 *local_1808;
  u64 *local_1800;
  u64 *local_17f8;
  u64 *local_17f0;
  u64 *local_17e8;
  u64 *local_17e0;
  undefined1 *local_17d8;
  undefined8 *local_17d0;
  undefined8 *local_17c8;
  undefined1 *local_17c0;
  undefined8 *local_17b8;
  u64 *local_17b0;
  extent *local_17a8;
  undefined8 *local_17a0;
  u64 *local_1798;
  extent *local_1790;
  undefined8 *local_1788;
  u64 *local_1780;
  ulong *local_1778;
  undefined8 local_1770;
  int local_1768;
  undefined8 local_1760;
  int local_1758;
  extent *local_1750;
  undefined8 local_1748;
  int local_1740;
  undefined8 local_1738;
  int local_1730;
  undefined8 local_1728;
  int local_1720;
  extent *local_1718;
  undefined8 local_1710;
  int local_1708;
  undefined8 local_1700;
  int local_16f8;
  undefined8 local_16f0;
  int local_16e8;
  extent *local_16e0;
  undefined8 local_16d8;
  int local_16d0;
  undefined8 local_16c8;
  int local_16c0;
  undefined8 local_16b8;
  int local_16b0;
  extent *local_16a8;
  undefined8 local_16a0;
  int local_1698;
  long local_1690;
  long local_1688;
  long local_1680;
  long local_1678;
  long local_1670;
  long local_1668;
  long local_1660;
  long local_1658;
  long local_1650;
  long local_1648;
  long local_1640;
  long local_1638;
  long local_1630;
  long local_1628;
  long local_1620;
  long local_1618;
  long local_1610;
  long local_1608;
  int local_15fc;
  stack_array<idx2::v3<int>,_16> *local_15f8;
  int local_15ec;
  stack_array<idx2::v3<int>,_16> *local_15e8;
  int local_15dc;
  stack_array<idx2::v3<int>,_16> *local_15d8;
  int local_15cc;
  stack_array<idx2::v3<int>,_16> *local_15c8;
  int local_15bc;
  stack_array<idx2::v3<int>,_16> *local_15b8;
  int local_15ac;
  stack_array<idx2::v3<int>,_16> *local_15a8;
  int local_159c;
  stack_array<idx2::v3<int>,_16> *local_1598;
  int local_158c;
  stack_array<idx2::v3<int>,_16> *local_1588;
  int local_157c;
  stack_array<idx2::v3<int>,_16> *local_1578;
  int local_156c;
  stack_array<idx2::v3<int>,_16> *local_1568;
  int local_155c;
  stack_array<idx2::v3<int>,_16> *local_1558;
  int local_154c;
  stack_array<idx2::v3<int>,_16> *local_1548;
  int local_153c;
  stack_array<idx2::v3<int>,_16> *local_1538;
  int local_152c;
  int local_1528;
  int local_1524;
  undefined8 *local_1520;
  int local_1514;
  int local_1510;
  int local_150c;
  undefined8 *local_1508;
  int local_14fc;
  int local_14f8;
  int local_14f4;
  undefined8 *local_14f0;
  int local_14e4;
  int local_14e0;
  int local_14dc;
  undefined8 *local_14d8;
  int local_14cc;
  int local_14c8;
  int local_14c4;
  undefined8 *local_14c0;
  int local_14b4;
  int local_14b0;
  int local_14ac;
  undefined8 *local_14a8;
  uint local_149c;
  int local_1498;
  int local_1494;
  undefined8 *local_1490;
  int local_1484;
  undefined4 local_1480;
  undefined4 local_147c;
  undefined4 *local_1478;
  int local_146c;
  int local_1468;
  int local_1464;
  int *local_1460;
  int local_1454;
  int local_1450;
  int local_144c;
  int *local_1448;
  int local_143c;
  stack_array<unsigned_long,_16> *local_1438;
  int local_142c;
  stack_array<unsigned_long,_16> *local_1428;
  int local_141c;
  stack_array<unsigned_long,_16> *local_1418;
  int local_140c;
  stack_array<unsigned_long,_16> *local_1408;
  int local_13fc;
  stack_array<unsigned_long,_16> *local_13f8;
  int local_13ec;
  stack_array<unsigned_long,_16> *local_13e8;
  brick_traverse *local_13e0;
  int local_13d8;
  int *local_13d0;
  undefined8 *local_13c8;
  undefined8 local_13c0;
  int local_13b4;
  int local_13b0;
  int local_13ac;
  undefined8 *local_13a8;
  chunk_traverse *local_13a0;
  int local_1398;
  int *local_1390;
  undefined8 *local_1388;
  undefined8 local_1380;
  int local_1374;
  int local_1370;
  int local_136c;
  undefined8 *local_1368;
  file_traverse *local_1360;
  int local_1358;
  undefined4 *local_1350;
  undefined4 *local_1348;
  undefined8 local_1340;
  int local_1334;
  undefined4 local_1330;
  undefined4 local_132c;
  undefined8 *local_1328;
  undefined4 local_131c;
  undefined8 *local_1318;
  undefined4 local_130c;
  undefined8 *local_1308;
  undefined4 local_12fc;
  undefined8 *local_12f8;
  undefined8 local_12f0;
  int local_12e8;
  u64 *local_12e0;
  undefined1 *local_12d8;
  undefined8 local_12d0;
  int local_12c4;
  int local_12c0;
  int local_12bc;
  undefined8 *local_12b8;
  undefined8 local_12b0;
  uint local_12a8;
  u64 *local_12a0;
  undefined1 *local_1298;
  undefined8 local_1290;
  uint local_1284;
  int local_1280;
  int local_127c;
  undefined8 *local_1278;
  undefined8 local_1270;
  int local_1268;
  u64 *local_1260;
  undefined1 *local_1258;
  undefined8 local_1250;
  int local_1244;
  int local_1240;
  int local_123c;
  undefined8 *local_1238;
  undefined8 local_1230;
  uint local_1228;
  u64 *local_1220;
  undefined1 *local_1218;
  undefined8 local_1210;
  uint local_1204;
  int local_1200;
  int local_11fc;
  undefined8 *local_11f8;
  undefined8 local_11f0;
  int local_11e8;
  u64 *local_11e0;
  undefined1 *local_11d8;
  undefined8 local_11d0;
  int local_11c4;
  int local_11c0;
  int local_11bc;
  undefined8 *local_11b8;
  undefined8 local_11b0;
  uint local_11a8;
  u64 *local_11a0;
  undefined1 *local_1198;
  undefined8 local_1190;
  uint local_1184;
  int local_1180;
  int local_117c;
  undefined8 *local_1178;
  u64 local_1170;
  int local_1168;
  u64 *local_1160;
  int *local_1158;
  undefined8 local_1150;
  int local_1144;
  int local_1140;
  int local_113c;
  undefined8 *local_1138;
  undefined8 local_1130;
  int local_1128;
  u64 *local_1120;
  int *local_1118;
  undefined8 local_1110;
  int local_1104;
  int local_1100;
  int local_10fc;
  undefined8 *local_10f8;
  undefined8 local_10f0;
  int local_10e8;
  u64 *local_10e0;
  int *local_10d8;
  undefined8 local_10d0;
  int local_10c4;
  int local_10c0;
  int local_10bc;
  undefined8 *local_10b8;
  uint local_10ac;
  u64 *local_10a8;
  uint local_109c;
  ulong *local_1098;
  uint local_108c;
  long local_1088;
  uint local_107c;
  ulong *local_1078;
  uint local_106c;
  undefined1 *local_1068;
  uint local_105c;
  ulong *local_1058;
  uint local_104c;
  long local_1048;
  uint local_103c;
  ulong *local_1038;
  uint local_102c;
  u64 *local_1028;
  uint local_101c;
  ulong *local_1018;
  uint local_100c;
  long local_1008;
  uint local_ffc;
  ulong *local_ff8;
  uint local_fec;
  undefined1 *local_fe8;
  uint local_fdc;
  ulong *local_fd8;
  uint local_fcc;
  long local_fc8;
  uint local_fbc;
  ulong *local_fb8;
  uint local_fac;
  u64 *local_fa8;
  uint local_f9c;
  ulong *local_f98;
  uint local_f8c;
  long local_f88;
  uint local_f7c;
  ulong *local_f78;
  uint local_f6c;
  undefined1 *local_f68;
  uint local_f5c;
  ulong *local_f58;
  uint local_f4c;
  long local_f48;
  uint local_f3c;
  ulong *local_f38;
  long *local_f30;
  long *local_f28;
  long *local_f20;
  long *local_f18;
  long *local_f10;
  undefined8 *local_f08;
  long *local_f00;
  undefined8 *local_ef8;
  long *local_ef0;
  undefined8 *local_ee8;
  long *local_ee0;
  undefined8 *local_ed8;
  long *local_ed0;
  undefined8 *local_ec8;
  long *local_ec0;
  undefined8 *local_eb8;
  undefined8 *local_eb0;
  undefined1 *local_ea8;
  undefined8 *local_ea0;
  undefined8 *local_e98;
  u64 *local_e90;
  undefined1 *local_e88;
  undefined8 *local_e80;
  undefined8 *local_e78;
  u64 *local_e70;
  undefined1 *local_e68;
  undefined8 *local_e60;
  undefined8 *local_e58;
  u64 *local_e50;
  undefined1 *local_e48;
  undefined8 *local_e40;
  undefined8 *local_e38;
  u64 *local_e30;
  undefined1 *local_e28;
  undefined8 *local_e20;
  undefined8 *local_e18;
  u64 *local_e10;
  undefined1 *local_e08;
  undefined8 *local_e00;
  undefined8 *local_df8;
  u64 *local_df0;
  undefined8 local_de8;
  int local_de0;
  undefined8 local_dd8;
  int local_dd0;
  undefined8 local_dc8;
  int local_dc0;
  undefined8 local_db8;
  int local_db0;
  undefined8 local_da8;
  int local_da0;
  undefined8 local_d98;
  int local_d90;
  u64 *local_d88;
  undefined8 local_d80;
  int local_d78;
  undefined8 local_d70;
  int local_d68;
  undefined8 local_d60;
  int local_d58;
  u64 *local_d50;
  undefined8 local_d48;
  int local_d40;
  undefined8 local_d38;
  int local_d30;
  undefined8 *local_d28;
  undefined8 *local_d20;
  undefined8 local_d18;
  int local_d0c;
  int local_d08;
  int local_d04;
  undefined8 *local_d00;
  undefined8 local_cf8;
  int local_cf0;
  undefined8 local_ce8;
  int local_ce0;
  undefined8 local_cd8;
  int local_cd0;
  undefined8 local_cc8;
  int local_cc0;
  undefined8 local_cb8;
  int local_cb0;
  undefined8 local_ca8;
  int local_ca0;
  u64 *local_c98;
  undefined8 local_c90;
  int local_c88;
  undefined8 local_c80;
  int local_c78;
  undefined8 local_c70;
  int local_c68;
  u64 *local_c60;
  undefined8 local_c58;
  int local_c50;
  undefined8 local_c48;
  int local_c40;
  undefined8 *local_c38;
  undefined8 *local_c30;
  undefined8 local_c28;
  int local_c1c;
  int local_c18;
  int local_c14;
  undefined8 *local_c10;
  undefined8 local_c08;
  int local_c00;
  undefined8 local_bf8;
  int local_bf0;
  undefined8 local_be8;
  int local_be0;
  undefined8 local_bd8;
  int local_bd0;
  undefined8 local_bc8;
  int local_bc0;
  undefined8 local_bb8;
  int local_bb0;
  u64 *local_ba8;
  undefined8 local_ba0;
  int local_b98;
  undefined8 local_b90;
  int local_b88;
  undefined8 local_b80;
  int local_b78;
  u64 *local_b70;
  undefined8 local_b68;
  int local_b60;
  undefined8 local_b58;
  int local_b50;
  undefined8 *local_b48;
  undefined8 *local_b40;
  undefined8 local_b38;
  int local_b2c;
  int local_b28;
  int local_b24;
  undefined8 *local_b20;
  undefined8 local_b18;
  int local_b10;
  undefined8 local_b08;
  int local_b00;
  undefined8 local_af8;
  int local_af0;
  undefined8 local_ae8;
  int local_ae0;
  undefined8 local_ad8;
  int local_ad0;
  undefined8 local_ac8;
  int local_ac0;
  u64 *local_ab8;
  undefined8 local_ab0;
  int local_aa8;
  undefined8 local_aa0;
  int local_a98;
  undefined8 local_a90;
  int local_a88;
  u64 *local_a80;
  undefined8 local_a78;
  int local_a70;
  undefined8 local_a68;
  int local_a60;
  undefined8 *local_a58;
  undefined8 *local_a50;
  undefined8 local_a48;
  int local_a3c;
  int local_a38;
  int local_a34;
  undefined8 *local_a30;
  undefined8 local_a28;
  int local_a20;
  undefined8 local_a18;
  int local_a10;
  undefined8 local_a08;
  int local_a00;
  undefined8 local_9f8;
  int local_9f0;
  undefined8 local_9e8;
  int local_9e0;
  undefined8 local_9d8;
  int local_9d0;
  u64 *local_9c8;
  undefined8 local_9c0;
  int local_9b8;
  undefined8 local_9b0;
  int local_9a8;
  undefined8 local_9a0;
  int local_998;
  u64 *local_990;
  undefined8 local_988;
  int local_980;
  undefined8 local_978;
  int local_970;
  undefined8 *local_968;
  undefined8 *local_960;
  undefined8 local_958;
  int local_94c;
  int local_948;
  int local_944;
  undefined8 *local_940;
  undefined8 local_938;
  int local_930;
  undefined8 local_928;
  int local_920;
  undefined8 local_918;
  int local_910;
  undefined8 local_908;
  int local_900;
  undefined8 local_8f8;
  int local_8f0;
  undefined8 local_8e8;
  int local_8e0;
  u64 *local_8d8;
  undefined8 local_8d0;
  int local_8c8;
  undefined8 local_8c0;
  int local_8b8;
  undefined8 local_8b0;
  int local_8a8;
  u64 *local_8a0;
  undefined8 local_898;
  int local_890;
  undefined8 local_888;
  int local_880;
  undefined8 *local_878;
  undefined8 *local_870;
  undefined8 local_868;
  int local_85c;
  int local_858;
  int local_854;
  undefined8 *local_850;
  undefined8 local_848;
  int local_840;
  undefined8 local_838;
  int local_830;
  u64 *local_828;
  undefined8 local_820;
  int local_818;
  undefined8 local_810;
  int local_808;
  undefined8 local_800;
  int local_7f8;
  u64 *local_7f0;
  undefined8 local_7e8;
  int local_7e0;
  undefined8 local_7d8;
  int local_7d0;
  undefined8 local_7c8;
  int local_7c0;
  u64 *local_7b8;
  undefined8 local_7b0;
  int local_7a8;
  undefined8 local_7a0;
  int local_798;
  undefined8 local_790;
  int local_788;
  u64 *local_780;
  undefined8 local_778;
  int local_770;
  undefined8 local_768;
  int local_760;
  undefined8 local_758;
  int local_750;
  u64 *local_748;
  undefined8 local_740;
  int local_738;
  undefined8 local_730;
  int local_728;
  undefined8 local_720;
  int local_718;
  u64 *local_710;
  undefined8 local_708;
  int local_700;
  undefined8 local_6f8;
  int local_6f0;
  undefined8 local_6e8;
  int local_6e0;
  u64 *local_6d8;
  undefined8 local_6d0;
  int local_6c8;
  undefined8 local_6c0;
  int local_6b8;
  undefined8 local_6b0;
  int local_6a8;
  u64 *local_6a0;
  undefined8 local_698;
  int local_690;
  u64 local_688;
  int local_680;
  u64 local_678;
  int local_670;
  u64 *local_668;
  u64 local_660;
  int local_658;
  undefined8 local_650;
  int local_648;
  undefined8 local_640;
  int local_638;
  u64 *local_630;
  undefined8 local_628;
  int local_620;
  u64 local_618;
  int local_610;
  u64 local_608;
  int local_600;
  u64 *local_5f8;
  u64 local_5f0;
  int local_5e8;
  undefined8 local_5e0;
  int local_5d8;
  undefined8 local_5d0;
  int local_5c8;
  u64 *local_5c0;
  undefined8 local_5b8;
  int local_5b0;
  undefined8 local_5a8;
  int local_5a0;
  u64 local_598;
  undefined8 local_590;
  int local_584;
  int local_580;
  int local_57c;
  undefined8 *local_578;
  u64 local_570;
  int local_568;
  u64 local_560;
  undefined8 local_558;
  int local_54c;
  int local_548;
  int local_544;
  undefined8 *local_540;
  undefined8 local_538;
  int local_530;
  u64 local_528;
  undefined8 local_520;
  int local_514;
  int local_510;
  int local_50c;
  undefined8 *local_508;
  u64 local_500;
  int local_4f8;
  u64 local_4f0;
  undefined8 local_4e8;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  undefined8 *local_4d0;
  undefined8 local_4c8;
  int local_4c0;
  u64 local_4b8;
  undefined8 local_4b0;
  int local_4a4;
  int local_4a0;
  int local_49c;
  undefined8 *local_498;
  undefined8 local_490;
  int local_488;
  u64 local_480;
  undefined8 local_478;
  int local_46c;
  int local_468;
  int local_464;
  undefined8 *local_460;
  undefined8 local_458;
  int local_450;
  u64 local_448;
  undefined8 local_440;
  int local_434;
  int local_430;
  int local_42c;
  undefined8 *local_428;
  undefined8 local_420;
  int local_418;
  u64 local_410;
  undefined8 local_408;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  undefined8 *local_3f0;
  undefined8 local_3e8;
  int local_3e0;
  u64 local_3d8;
  undefined8 local_3d0;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  undefined8 *local_3b8;
  undefined8 local_3b0;
  int local_3a8;
  u64 local_3a0;
  undefined8 local_398;
  int local_38c;
  int local_388;
  int local_384;
  undefined8 *local_380;
  undefined8 local_378;
  int local_370;
  u64 local_368;
  undefined8 local_360;
  int local_354;
  int local_350;
  int local_34c;
  undefined8 *local_348;
  undefined8 local_340;
  int local_338;
  u64 local_330;
  undefined8 local_328;
  int local_31c;
  int local_318;
  int local_314;
  undefined8 *local_310;
  undefined8 local_308;
  int local_300;
  undefined8 local_2f0;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  undefined8 *local_2d8;
  undefined8 local_2d0;
  int local_2c8;
  undefined8 local_2b8;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  undefined8 *local_2a0;
  undefined8 local_298;
  int local_290;
  u64 local_288;
  undefined8 local_280;
  int local_274;
  int local_270;
  int local_26c;
  undefined8 *local_268;
  undefined8 local_260;
  int local_258;
  u64 local_250;
  undefined8 local_248;
  int local_23c;
  int local_238;
  int local_234;
  undefined8 *local_230;
  undefined8 local_228;
  int local_220;
  u64 local_218;
  undefined8 local_210;
  int local_204;
  int local_200;
  int local_1fc;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  int local_1e8;
  u64 local_1e0;
  undefined8 local_1d8;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  int local_1b0;
  u64 local_1a8;
  undefined8 local_1a0;
  int local_194;
  int local_190;
  int local_18c;
  undefined8 *local_188;
  undefined8 local_180;
  int local_178;
  u64 local_170;
  undefined8 local_168;
  int local_15c;
  int local_158;
  int local_154;
  undefined8 *local_150;
  undefined8 local_148;
  int local_140;
  u64 local_138;
  undefined8 local_130;
  int local_124;
  int local_120;
  int local_11c;
  undefined8 *local_118;
  undefined8 local_110;
  int local_108;
  u64 local_100;
  undefined8 local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  undefined8 *local_e0;
  undefined8 *local_d8;
  u64 *local_d0;
  undefined8 *local_c8;
  u64 *local_c0;
  undefined8 *local_b8;
  u64 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined1 local_91;
  ulong local_90;
  undefined1 local_81;
  ulong local_80;
  undefined1 local_71;
  ulong local_70;
  undefined1 local_61;
  ulong local_60;
  undefined1 local_51;
  ulong local_50;
  undefined1 local_41;
  ulong local_40;
  undefined1 local_31;
  ulong local_30;
  undefined1 local_21;
  ulong local_20;
  undefined1 local_11;
  ulong local_10;
  
  Level_00 = Idx2->NLevels + -1;
  local_1800 = &ExtentInChunks.Dims;
  ExtentInChunks.Dims = 0;
  local_17f8 = &ExtentInFiles.Dims;
  ExtentInFiles.Dims = 0;
  ExtentInChunks.From = 0;
  local_17f0 = &VolExtentInBricks.Dims;
  VolExtentInBricks.Dims = 0;
  ExtentInFiles.From = 0;
  local_17e8 = &VolExtentInChunks.Dims;
  VolExtentInChunks.Dims = 0;
  VolExtentInBricks.From = 0;
  local_17e0 = &VolExtentInFiles.Dims;
  VolExtentInFiles.Dims = 0;
  VolExtentInChunks.From = 0;
  local_17d8 = (undefined1 *)((long)&B3.field_0 + 4);
  B3.field_0.field_4.YZ.field_0 = (v2<int>)(anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
  VolExtentInFiles.From = 0;
  ComputeExtentsForTraversal
            (Idx2,&P->DecodeExtent,Level_00,(extent *)&ExtentInChunks.Dims,
             (extent *)&ExtentInFiles.Dims,(extent *)&VolExtentInBricks.Dims,
             (extent *)&VolExtentInChunks.Dims,(extent *)&VolExtentInFiles.Dims,
             (extent *)((long)&B3.field_0.field_3.XY.field_0 + 4));
  local_18c0 = &Idx2->BrickDims3;
  _I = &Idx2->GroupBrick3;
  local_1874 = (int)Level_00;
  local_1828 = &local_1864;
  local_182c = 1;
  local_1864._0_4_ = 1;
  local_1864._4_4_ = 1;
  Result.field_0.field_0.X = 1;
  local_1878 = 0;
  while( true ) {
    if (local_1874 <= local_1878) break;
    local_1524 = (int)local_1864 * (_I->field_0).field_0.X;
    local_1528 = local_1864._4_4_ * (Idx2->GroupBrick3).field_0.field_0.Y;
    Result.field_0.field_0.X = Result.field_0.field_0.X * (Idx2->GroupBrick3).field_0.field_0.Z;
    local_1520 = &local_1838;
    local_1838._0_4_ = local_1524;
    local_1838._4_4_ = local_1528;
    local_1864 = local_1838;
    local_1878 = local_1878 + 1;
    local_152c = Result.field_0.field_0.X;
  }
  local_18a0 = Result.field_0.field_0.X;
  local_18a8 = local_1864;
  local_1a80 = Result.field_0.field_0.X;
  local_1a88 = local_1864;
  local_18c8 = &local_1a88;
  local_150c = (local_18c0->field_0).field_0.X * (int)local_1864;
  local_1510 = (Idx2->BrickDims3).field_0.field_0.Y * local_1864._4_4_;
  B3.field_0.field_0.X = (Idx2->BrickDims3).field_0.field_0.Z * Result.field_0.field_0.X;
  local_1508 = &local_18b4;
  local_18b4._0_4_ = local_150c;
  local_18b4._4_4_ = local_1510;
  local_18d8 = local_18b4;
  local_1a7c = local_18b4;
  local_18d0 = B3.field_0.field_0.X;
  local_1514 = B3.field_0.field_0.X;
  decode_state::decode_state((decode_state *)&FileStack[0x3f].Address);
  local_4fb0 = (file_traverse *)((long)&FileDims3Ext.field_0.field_4.YZ.field_0 + 4);
  do {
    file_traverse::file_traverse(local_4fb0);
    local_4fb0 = local_4fb0 + 1;
  } while (local_4fb0 != (file_traverse *)&FileStack[0x3f].Address);
  FileDims3Ext.field_0.field_0.Y = 0;
  local_1538 = &Idx2->NFiles3;
  local_153c = (int)Level_00;
  if (0xf < local_153c) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                 );
  }
  local_1610 = (long)local_1538->Arr[local_153c].field_0.field_0.X;
  if (local_1610 == 0) {
    local_1608 = 1;
  }
  else {
    local_90 = local_1610 - 1;
    local_91 = 0xff;
    if (local_90 == 0) {
      local_4fc9 = -1;
    }
    else {
      lVar16 = 0x3f;
      if (local_90 != 0) {
        for (; local_90 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      local_4fc9 = '?' - ((byte)lVar16 ^ 0x3f);
    }
    local_1608 = 1L << (local_4fc9 + 1U & 0x3f);
  }
  local_147c = (undefined4)local_1608;
  local_1548 = &Idx2->NFiles3;
  local_154c = (int)Level_00;
  if (0xf < local_154c) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                 );
  }
  local_1620 = (long)local_1548->Arr[local_154c].field_0.field_0.Y;
  if (local_1620 == 0) {
    local_1618 = 1;
  }
  else {
    local_80 = local_1620 - 1;
    local_81 = 0xff;
    if (local_80 == 0) {
      local_4fdd = -1;
    }
    else {
      lVar16 = 0x3f;
      if (local_80 != 0) {
        for (; local_80 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      local_4fdd = '?' - ((byte)lVar16 ^ 0x3f);
    }
    local_1618 = 1L << (local_4fdd + 1U & 0x3f);
  }
  local_1480 = (undefined4)local_1618;
  local_1558 = &Idx2->NFiles3;
  local_155c = (int)Level_00;
  if (0xf < local_155c) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                 );
  }
  local_1630 = (long)local_1558->Arr[local_155c].field_0.field_0.Z;
  if (local_1630 == 0) {
    local_1628 = 1;
  }
  else {
    local_70 = local_1630 - 1;
    local_71 = 0xff;
    if (local_70 == 0) {
      local_4fed = -1;
    }
    else {
      lVar16 = 0x3f;
      if (local_70 != 0) {
        for (; local_70 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      local_4fed = '?' - ((byte)lVar16 ^ 0x3f);
    }
    local_1628 = 1L << (local_4fed + 1U & 0x3f);
  }
  local_1478 = &local_2718;
  local_2760 = (int)local_1628;
  local_13e8 = &Idx2->FilesOrder;
  local_13ec = (int)Level_00;
  local_1484 = local_2760;
  local_2718 = local_147c;
  local_2714 = local_1480;
  FileDims3Ext.field_0.field_0.X = local_2760;
  if (0xf < local_13ec) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
                 );
  }
  local_2748 = local_13e8->Arr[local_13ec];
  local_13f8 = &Idx2->FilesOrder;
  local_13fc = (int)Level_00;
  if (0xf < local_13fc) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
                 );
  }
  local_2740 = local_13f8->Arr[local_13fc];
  local_1818 = &local_2738;
  local_181c = 0;
  local_2738 = 0;
  local_2734 = 0;
  local_2730 = 0;
  local_1808 = &local_2754;
  local_180c = 0;
  local_2754 = 0;
  local_2750 = 0;
  local_274c = 0;
  local_1350 = &local_2718;
  local_1328 = &local_1340;
  local_1340._0_4_ = local_147c;
  local_1340._4_4_ = local_1480;
  local_1360 = local_1340;
  FileTop = local_1340;
  local_272c = local_1340;
  local_2720 = 0;
  local_2724 = local_2760;
  local_1358 = local_2760;
  local_1348 = local_1808;
  local_1334 = local_2760;
  local_1330 = local_1480;
  local_132c = local_147c;
  memcpy((void *)((long)&FileDims3Ext.field_0 + 8),&local_2748,0x30);
  do {
    while( true ) {
      while( true ) {
        if (FileDims3Ext.field_0.field_0.Y < 0) {
          eVar19 = TraverseFirstLevel::anon_class_1_0_00000001::operator()(&local_4f89);
          auVar5 = eVar19._0_11_;
          eVar19._11_5_ = uStack_19cd;
          eVar19.Msg = (cstr)auVar5._0_8_;
          eVar19.Code = auVar5[8];
          eVar19.StackIdx = auVar5[9];
          eVar19.StrGened = (bool)auVar5[10];
          return eVar19;
        }
        lVar16 = (long)FileDims3Ext.field_0.field_0.Y;
        puStack_2770 = (ulong *)((long)&(&FileDims3Ext)[lVar16 * 4].field_0.field_4.YZ.field_0 + 4);
        local_2774 = (uint)*puStack_2770 & 3;
        *puStack_2770 = *puStack_2770 >> 2;
        if (local_2774 != 3) break;
        if (*puStack_2770 == 3) {
          *puStack_2770 = FileStack[lVar16].FileOrder;
        }
        else {
          FileStack[lVar16].FileOrder = *puStack_2770;
        }
      }
      FileDims3Ext.field_0.field_0.Y = FileDims3Ext.field_0.field_0.Y + -1;
      local_10d8 = &FileStack[lVar16].FileFrom3.field_0.field_0.Y;
      local_10e0 = &FileStack[lVar16].PrevOrder;
      local_10bc = *local_10d8 - (int)*local_10e0;
      local_10c0 = FileStack[lVar16].FileFrom3.field_0.field_0.Z -
                   *(int *)((long)&FileStack[lVar16].PrevOrder + 4);
      local_2778 = FileStack[lVar16].FileTo3.field_0.field_0.X -
                   FileStack[lVar16].FileFrom3.field_0.field_0.X;
      local_10b8 = &local_10d0;
      local_10d0._0_4_ = local_10bc;
      local_10d0._4_4_ = local_10c0;
      local_10f0 = local_10d0;
      local_2780 = local_10d0;
      uVar7 = local_2780;
      local_12f8 = &local_2780;
      local_12fc = 1;
      local_2780._0_4_ = (int)local_10d0;
      bVar18 = false;
      if ((int)local_2780 == 1) {
        local_2780._4_4_ = (int)((ulong)local_10d0 >> 0x20);
        bVar18 = false;
        if (local_2780._4_4_ == 1) {
          bVar18 = local_2778 == 1;
        }
      }
      local_2780 = uVar7;
      local_10e8 = local_2778;
      local_10c4 = local_2778;
      if (bVar18) break;
      memcpy(&Second.Address,puStack_2770,0x30);
      memcpy(&Skip.Dims,puStack_2770,0x30);
      local_1038 = puStack_2770 + 2;
      local_103c = local_2774;
      if (2 < (int)local_2774) {
        __assert_fail("Idx < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
      }
      local_1048 = (long)puStack_2770 + 0x1c;
      local_104c = local_2774;
      if (2 < (int)local_2774) {
        __assert_fail("Idx < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
      }
      local_1058 = puStack_2770 + 2;
      local_105c = local_2774;
      if (2 < (int)local_2774) {
        __assert_fail("Idx < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
      }
      local_1068 = (undefined1 *)((long)&First.FileFrom3.field_0 + 4);
      local_106c = local_2774;
      if (2 < (int)local_2774) {
        __assert_fail("Idx < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
      }
      *(int *)(local_1068 + (long)(int)local_2774 * 4) =
           *(int *)((long)local_1038 + (long)(int)local_2774 * 4) +
           (*(int *)(local_1048 + (long)(int)local_2774 * 4) -
           *(int *)((long)local_1058 + (long)(int)local_2774 * 4)) / 2;
      local_1078 = puStack_2770 + 2;
      local_107c = local_2774;
      if (2 < (int)local_2774) {
        __assert_fail("Idx < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
      }
      local_1088 = (long)puStack_2770 + 0x1c;
      local_108c = local_2774;
      if (2 < (int)local_2774) {
        __assert_fail("Idx < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
      }
      local_1098 = puStack_2770 + 2;
      local_109c = local_2774;
      if (2 < (int)local_2774) {
        __assert_fail("Idx < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
      }
      local_10a8 = &Second.PrevOrder;
      local_10ac = local_2774;
      if (2 < (int)local_2774) {
        __assert_fail("Idx < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
      }
      *(int *)((long)local_10a8 + (long)(int)local_2774 * 4) =
           *(int *)((long)local_1078 + (long)(int)local_2774 * 4) +
           (*(int *)(local_1088 + (long)(int)local_2774 * 4) -
           *(int *)((long)local_1098 + (long)(int)local_2774 * 4)) / 2;
      local_1780 = &First.PrevOrder;
      local_12d8 = (undefined1 *)((long)&First.FileFrom3.field_0 + 4);
      local_127c = First.FileFrom3.field_0.field_0.Y - (uint)First.PrevOrder;
      local_1280 = First.FileFrom3.field_0.field_0.Z - First.PrevOrder._4_4_;
      local_4ec8 = First.FileTo3.field_0.field_0.X - First.FileFrom3.field_0._0_4_;
      local_1278 = &local_1290;
      local_1290._0_4_ = local_127c;
      local_1290._4_4_ = local_1280;
      local_12b0 = local_1290;
      local_4ed0 = local_1290;
      local_4ec0 = local_1290;
      uVar10 = local_4ec0;
      local_1778 = &local_4eb0;
      local_1788 = &local_4ec0;
      local_4eb0 = (ulong)((uint)First.PrevOrder & 0x1fffff) |
                   (ulong)(First.PrevOrder._4_4_ & 0x1fffff) << 0x15 |
                   (ulong)(First.FileFrom3.field_0.field_0.X & 0x1fffff) << 0x2a;
      local_4ec0._0_4_ = (uint)local_1290;
      local_4ec0._4_4_ = (uint)((ulong)local_1290 >> 0x20);
      Skip.From = (ulong)((uint)local_4ec0 & 0x1fffff) |
                  (ulong)(local_4ec0._4_4_ & 0x1fffff) << 0x15 |
                  (ulong)(local_4eb8 & 0x1fffff) << 0x2a;
      First.FileTo3.field_0.field_4.YZ.field_0 =
           (v2<int>)*(anon_union_8_4_6ba14846_for_v2<int>_1 *)(puStack_2770 + 5);
      local_12bc = First.FileFrom3.field_0.field_0.Y - (uint)First.PrevOrder;
      local_12c0 = First.FileFrom3.field_0.field_0.Z - First.PrevOrder._4_4_;
      local_4f00 = First.FileTo3.field_0.field_0.X - First.FileFrom3.field_0._0_4_;
      local_12b8 = &local_12d0;
      local_12d0._0_4_ = local_12bc;
      local_12d0._4_4_ = local_12c0;
      local_12f0 = local_12d0;
      local_4f08 = local_12d0;
      local_4ef8 = local_12d0;
      uVar9 = local_4ef8;
      local_f30 = &local_4ee8;
      local_ec8 = &local_4ef8;
      local_4ef8._0_4_ = (int)local_12d0;
      local_4ee8 = (long)(int)local_4ef8;
      local_4ef8._4_4_ = (int)((ulong)local_12d0 >> 0x20);
      local_4ee0 = (long)local_4ef8._4_4_;
      local_4ed8 = (long)local_4ef0;
      Second.FileTo3.field_0.field_4.YZ.field_0 =
           (v2<int>)(puStack_2770[5] + local_4ee8 * local_4ee0 * local_4ed8);
      local_e70 = &Second.PrevOrder;
      local_c98 = &VolExtentInBricks.Dims;
      local_410 = VolExtentInBricks.Dims;
      local_3f4 = ((int)VolExtentInBricks.Dims << 0xb) >> 0xb;
      local_3f0 = &local_408;
      local_3f8 = (int)((long)(VolExtentInBricks.Dims << 0x16) >> 0x2b);
      local_cb0 = (int)((long)(VolExtentInBricks.Dims * 2) >> 0x2b);
      local_408._0_4_ = local_3f4;
      local_408._4_4_ = local_3f8;
      local_420 = local_408;
      local_758 = local_408;
      local_740 = local_408;
      local_768 = local_408;
      local_cb8 = local_408;
      local_ca8 = local_408;
      uVar12 = local_ca8;
      local_218 = ExtentInFiles.From;
      local_1fc = ((int)ExtentInFiles.From << 0xb) >> 0xb;
      local_1f8 = &local_210;
      local_200 = (int)((long)(ExtentInFiles.From << 0x16) >> 0x2b);
      local_cd0 = (int)((long)(ExtentInFiles.From * 2) >> 0x2b);
      local_210._0_4_ = local_1fc;
      local_210._4_4_ = local_200;
      local_228 = local_210;
      local_c70 = local_210;
      local_c58 = local_210;
      local_c80 = local_210;
      local_cd8 = local_210;
      local_cc8 = local_210;
      uVar6 = local_cc8;
      local_c30 = &local_ca8;
      local_c38 = &local_cc8;
      local_ca8._0_4_ = (int)local_408;
      local_ca8._4_4_ = (int)((ulong)local_408 >> 0x20);
      local_cc8._0_4_ = (int)local_210;
      local_cc8._4_4_ = (int)((ulong)local_210 >> 0x20);
      local_c14 = (int)local_ca8 + (int)local_cc8;
      local_c18 = local_ca8._4_4_ + local_cc8._4_4_;
      local_4f20 = local_cb0 + local_cd0;
      local_c10 = &local_c28;
      local_c28._0_4_ = local_c14;
      local_c28._4_4_ = local_c18;
      local_c48 = local_c28;
      local_ce8 = local_c28;
      local_c90 = local_c28;
      local_cf8 = local_c28;
      local_4f28 = local_c28;
      local_4f14 = local_c28;
      uVar7 = local_4f14;
      local_e78 = &local_4f14;
      local_4f14._0_4_ = (int)local_c28;
      bVar18 = false;
      if ((int)Second.PrevOrder < (int)local_4f14) {
        local_4f14._4_4_ = (int)((ulong)local_c28 >> 0x20);
        bVar18 = false;
        if (Second.PrevOrder._4_4_ < local_4f14._4_4_) {
          bVar18 = Second.FileFrom3.field_0.field_0.X < local_4f20;
        }
      }
      bVar4 = false;
      if (bVar18) {
        local_6a0 = &VolExtentInBricks.Dims;
        local_4b8 = VolExtentInBricks.Dims;
        local_49c = ((int)VolExtentInBricks.Dims << 0xb) >> 0xb;
        local_498 = &local_4b0;
        local_4a0 = (int)((long)(VolExtentInBricks.Dims << 0x16) >> 0x2b);
        local_4f40 = (int)((long)(VolExtentInBricks.Dims * 2) >> 0x2b);
        local_4b0._0_4_ = local_49c;
        local_4b0._4_4_ = local_4a0;
        local_4c8 = local_4b0;
        local_6b0 = local_4b0;
        local_698 = local_4b0;
        local_6c0 = local_4b0;
        local_4f48 = local_4b0;
        local_4f34 = local_4b0;
        uVar8 = local_4f34;
        local_e88 = (undefined1 *)((long)&Second.FileFrom3.field_0 + 4);
        local_e80 = &local_4f34;
        local_4f34._0_4_ = (int)local_4b0;
        bVar4 = false;
        bVar18 = (int)local_4f34 < Second.FileFrom3.field_0.field_0.Y;
        local_4f34 = uVar8;
        local_4f2c = local_4f40;
        local_6b8 = local_4f40;
        local_6a8 = local_4f40;
        local_690 = local_4f40;
        local_4c0 = local_4f40;
        local_4a4 = local_4f40;
        if (bVar18) {
          local_4f34._4_4_ = (int)((ulong)local_4b0 >> 0x20);
          bVar4 = false;
          bVar18 = local_4f34._4_4_ < Second.FileFrom3.field_0.field_0.Z;
          if (bVar18) {
            bVar4 = local_4f40 < Second.FileTo3.field_0.field_0.X;
          }
        }
      }
      local_4f14 = uVar7;
      local_4f0c = local_4f20;
      local_4ef8 = uVar9;
      local_4ef0 = local_4f00;
      local_4ec0 = uVar10;
      local_4eb8 = local_4ec8;
      local_12e8 = local_4f00;
      local_12e0 = local_1780;
      local_12c4 = local_4f00;
      local_12a8 = local_4ec8;
      local_12a0 = local_1780;
      local_1298 = local_12d8;
      local_1284 = local_4ec8;
      local_ec0 = local_f30;
      local_cf0 = local_4f20;
      local_ce0 = local_4f20;
      local_cc8 = uVar6;
      local_cc0 = local_cd0;
      local_ca8 = uVar12;
      local_ca0 = local_cb0;
      local_c88 = local_4f20;
      local_c78 = local_cd0;
      local_c68 = local_cd0;
      local_c60 = local_c98;
      local_c50 = local_cd0;
      local_c40 = local_4f20;
      local_c1c = local_4f20;
      local_760 = local_cb0;
      local_750 = local_cb0;
      local_748 = local_c98;
      local_738 = local_cb0;
      local_418 = local_cb0;
      local_3fc = local_cb0;
      local_220 = local_cd0;
      local_204 = local_cd0;
      local_d8 = local_1788;
      local_d0 = local_1780;
      if (bVar4) {
        FileDims3Ext.field_0.field_0.Y = FileDims3Ext.field_0.field_0.Y + 1;
        memcpy((void *)((long)&(&FileDims3Ext)[(long)FileDims3Ext.field_0.field_0.Y * 4].field_0 + 8
                       ),&Skip.Dims,0x30);
      }
      local_e90 = &First.PrevOrder;
      local_d88 = &VolExtentInBricks.Dims;
      local_448 = VolExtentInBricks.Dims;
      local_42c = ((int)VolExtentInBricks.Dims << 0xb) >> 0xb;
      local_428 = &local_440;
      local_430 = (int)((long)(VolExtentInBricks.Dims << 0x16) >> 0x2b);
      local_da0 = (int)((long)(VolExtentInBricks.Dims * 2) >> 0x2b);
      local_440._0_4_ = local_42c;
      local_440._4_4_ = local_430;
      local_458 = local_440;
      local_720 = local_440;
      local_708 = local_440;
      local_730 = local_440;
      local_da8 = local_440;
      local_d98 = local_440;
      uVar10 = local_d98;
      local_1e0 = ExtentInFiles.From;
      local_1c4 = ((int)ExtentInFiles.From << 0xb) >> 0xb;
      local_1c0 = &local_1d8;
      local_1c8 = (int)((long)(ExtentInFiles.From << 0x16) >> 0x2b);
      local_dc0 = (int)((long)(ExtentInFiles.From * 2) >> 0x2b);
      local_1d8._0_4_ = local_1c4;
      local_1d8._4_4_ = local_1c8;
      local_1f0 = local_1d8;
      local_d60 = local_1d8;
      local_d48 = local_1d8;
      local_d70 = local_1d8;
      local_dc8 = local_1d8;
      local_db8 = local_1d8;
      uVar9 = local_db8;
      local_d20 = &local_d98;
      local_d28 = &local_db8;
      local_d98._0_4_ = (int)local_440;
      local_d98._4_4_ = (int)((ulong)local_440 >> 0x20);
      local_db8._0_4_ = (int)local_1d8;
      local_db8._4_4_ = (int)((ulong)local_1d8 >> 0x20);
      local_d04 = (int)local_d98 + (int)local_db8;
      local_d08 = local_d98._4_4_ + local_db8._4_4_;
      local_4f60 = local_da0 + local_dc0;
      local_d00 = &local_d18;
      local_d18._0_4_ = local_d04;
      local_d18._4_4_ = local_d08;
      local_d38 = local_d18;
      local_dd8 = local_d18;
      local_d80 = local_d18;
      local_de8 = local_d18;
      local_4f68 = local_d18;
      local_4f54 = local_d18;
      uVar7 = local_4f54;
      local_e98 = &local_4f54;
      local_4f54._0_4_ = (int)local_d18;
      bVar18 = false;
      if ((int)(uint)First.PrevOrder < (int)local_4f54) {
        local_4f54._4_4_ = (int)((ulong)local_d18 >> 0x20);
        bVar18 = false;
        if ((int)First.PrevOrder._4_4_ < local_4f54._4_4_) {
          bVar18 = First.FileFrom3.field_0.field_0.X < local_4f60;
        }
      }
      bVar4 = false;
      if (bVar18) {
        local_6d8 = &VolExtentInBricks.Dims;
        local_480 = VolExtentInBricks.Dims;
        local_464 = ((int)VolExtentInBricks.Dims << 0xb) >> 0xb;
        local_460 = &local_478;
        local_468 = (int)((long)(VolExtentInBricks.Dims << 0x16) >> 0x2b);
        local_4f80 = (int)((long)(VolExtentInBricks.Dims * 2) >> 0x2b);
        local_478._0_4_ = local_464;
        local_478._4_4_ = local_468;
        local_490 = local_478;
        local_6e8 = local_478;
        local_6d0 = local_478;
        local_6f8 = local_478;
        local_4f88 = local_478;
        local_4f74 = local_478;
        uVar6 = local_4f74;
        local_ea8 = (undefined1 *)((long)&First.FileFrom3.field_0 + 4);
        local_ea0 = &local_4f74;
        local_4f74._0_4_ = (int)local_478;
        bVar4 = false;
        bVar18 = (int)local_4f74 < First.FileFrom3.field_0.field_0.Y;
        local_4f74 = uVar6;
        local_4f6c = local_4f80;
        local_6f0 = local_4f80;
        local_6e0 = local_4f80;
        local_6c8 = local_4f80;
        local_488 = local_4f80;
        local_46c = local_4f80;
        if (bVar18) {
          local_4f74._4_4_ = (int)((ulong)local_478 >> 0x20);
          bVar4 = false;
          bVar18 = local_4f74._4_4_ < First.FileFrom3.field_0.field_0.Z;
          if (bVar18) {
            bVar4 = local_4f80 < First.FileTo3.field_0.field_0.X;
          }
        }
      }
      local_4f54 = uVar7;
      local_4f4c = local_4f60;
      local_de0 = local_4f60;
      local_dd0 = local_4f60;
      local_db8 = uVar9;
      local_db0 = local_dc0;
      local_d98 = uVar10;
      local_d90 = local_da0;
      local_d78 = local_4f60;
      local_d68 = local_dc0;
      local_d58 = local_dc0;
      local_d50 = local_d88;
      local_d40 = local_dc0;
      local_d30 = local_4f60;
      local_d0c = local_4f60;
      local_728 = local_da0;
      local_718 = local_da0;
      local_710 = local_d88;
      local_700 = local_da0;
      local_450 = local_da0;
      local_434 = local_da0;
      local_1e8 = local_dc0;
      local_1cc = local_dc0;
      if (bVar4) {
        FileDims3Ext.field_0.field_0.Y = FileDims3Ext.field_0.field_0.Y + 1;
        memcpy((void *)((long)&(&FileDims3Ext)[(long)FileDims3Ext.field_0.field_0.Y * 4].field_0 + 8
                       ),&Second.Address,0x30);
      }
    }
    local_5020 = (chunk_traverse *)((long)&ChunkDims3Ext.field_0.field_4.YZ.field_0 + 4);
    do {
      chunk_traverse::chunk_traverse(local_5020);
      local_5020 = local_5020 + 1;
    } while (local_5020 != (chunk_traverse *)&ChunkStack[0x3f].Address);
    ChunkDims3Ext.field_0.field_0.Y = 0;
    local_1568 = &Idx2->ChunksPerFile3s;
    local_156c = (int)Level_00;
    if (0xf < local_156c) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                   );
    }
    local_1640 = (long)local_1568->Arr[local_156c].field_0.field_0.X;
    if (local_1640 == 0) {
      local_1638 = 1;
    }
    else {
      local_60 = local_1640 - 1;
      local_61 = 0xff;
      if (local_60 == 0) {
        local_5039 = -1;
      }
      else {
        lVar16 = 0x3f;
        if (local_60 != 0) {
          for (; local_60 >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        local_5039 = '?' - ((byte)lVar16 ^ 0x3f);
      }
      local_1638 = 1L << (local_5039 + 1U & 0x3f);
    }
    iVar13 = (int)local_1638;
    local_1578 = &Idx2->ChunksPerFile3s;
    local_157c = (int)Level_00;
    if (0xf < local_157c) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                   );
    }
    local_1650 = (long)local_1578->Arr[local_157c].field_0.field_0.Y;
    if (local_1650 == 0) {
      local_1648 = 1;
    }
    else {
      local_50 = local_1650 - 1;
      local_51 = 0xff;
      if (local_50 == 0) {
        local_504d = -1;
      }
      else {
        lVar16 = 0x3f;
        if (local_50 != 0) {
          for (; local_50 >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        local_504d = '?' - ((byte)lVar16 ^ 0x3f);
      }
      local_1648 = 1L << (local_504d + 1U & 0x3f);
    }
    iVar14 = (int)local_1648;
    local_1588 = &Idx2->ChunksPerFile3s;
    local_158c = (int)Level_00;
    if (0xf < local_158c) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                   );
    }
    local_1660 = (long)local_1588->Arr[local_158c].field_0.field_0.Z;
    if (local_1660 == 0) {
      local_1658 = 1;
    }
    else {
      local_40 = local_1660 - 1;
      local_41 = 0xff;
      if (local_40 == 0) {
        local_505d = -1;
      }
      else {
        lVar16 = 0x3f;
        if (local_40 != 0) {
          for (; local_40 >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        local_505d = '?' - ((byte)lVar16 ^ 0x3f);
      }
      local_1658 = 1L << (local_505d + 1U & 0x3f);
    }
    local_1460 = &local_37a8;
    local_146c = (int)local_1658;
    local_1408 = &Idx2->ChunksOrderInFile;
    local_140c = (int)Level_00;
    local_1468 = iVar14;
    local_1464 = iVar13;
    local_37a8 = iVar13;
    local_37a4 = iVar14;
    ChunkDims3Ext.field_0.field_0.X = local_146c;
    if (0xf < local_140c) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
                   );
    }
    local_37e8 = local_1408->Arr[local_140c];
    local_1418 = &Idx2->ChunksOrderInFile;
    local_141c = (int)Level_00;
    if (0xf < local_141c) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
                   );
    }
    local_37e0 = local_1418->Arr[local_141c];
    puVar15 = puStack_2770 + 2;
    local_1598 = &Idx2->ChunksPerFile3s;
    local_159c = (int)Level_00;
    if (0xf < local_159c) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                   );
    }
    local_18f8 = local_1598->Arr + local_159c;
    local_14f4 = (int)*puVar15 * (local_18f8->field_0).field_0.X;
    local_14f8 = *(int *)((long)puStack_2770 + 0x14) * (local_18f8->field_0).field_0.Y;
    local_37f0 = (int)puStack_2770[3] * (local_18f8->field_0).field_0.Z;
    local_14f0 = &local_18e4;
    local_18e4._0_4_ = local_14f4;
    local_18e4._4_4_ = local_14f8;
    local_1908 = local_18e4;
    local_37f8 = local_18e4;
    local_37d8 = local_18e4;
    local_15a8 = &Idx2->ChunksPerFile3s;
    local_15ac = (int)Level_00;
    local_1900 = local_37f0;
    local_18f0 = puVar15;
    local_14fc = local_37f0;
    local_37d0 = local_37f0;
    if (0xf < local_15ac) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                   );
    }
    local_1928 = local_15a8->Arr + local_15ac;
    local_14dc = (int)puStack_2770[2] * (local_1928->field_0).field_0.X;
    local_14e0 = *(int *)((long)puStack_2770 + 0x14) * (local_1928->field_0).field_0.Y;
    local_3810 = (int)puStack_2770[3] * (local_1928->field_0).field_0.Z;
    local_14d8 = &local_1914;
    local_1914._0_4_ = local_14dc;
    local_1914._4_4_ = local_14e0;
    local_1938 = local_1914;
    local_3818 = local_1914;
    local_3808 = local_1914;
    uVar7 = local_3808;
    local_1388 = &local_3808;
    local_1390 = &local_37a8;
    local_3808._0_4_ = (int)local_1914;
    local_3808._4_4_ = (int)((ulong)local_1914 >> 0x20);
    local_136c = (int)local_3808 + iVar13;
    local_1370 = local_3808._4_4_ + iVar14;
    local_3820 = local_3810 + local_146c;
    local_1368 = &local_1380;
    local_1380._0_4_ = local_136c;
    local_1380._4_4_ = local_1370;
    local_13a0 = local_1380;
    ChunkTop = local_1380;
    local_37cc = local_1380;
    local_37c0 = 0;
    local_37b8 = 0;
    local_37b0 = 0;
    local_3808 = uVar7;
    local_3800 = local_3810;
    local_1930 = local_3810;
    local_1920 = puStack_2770 + 2;
    local_14e4 = local_3810;
    local_1398 = local_3820;
    local_1374 = local_3820;
    local_37c4 = local_3820;
    memcpy((void *)((long)&ChunkDims3Ext.field_0 + 8),&local_37e8,0x40);
    while (-1 < ChunkDims3Ext.field_0.field_0.Y) {
      lVar16 = (long)ChunkDims3Ext.field_0.field_0.Y;
      puStack_3830 = (ulong *)((long)&ChunkDims3Ext + lVar16 * 0x40 + 8);
      local_3834 = (uint)*puStack_3830 & 3;
      *puStack_3830 = *puStack_3830 >> 2;
      if (local_3834 == 3) {
        if (*puStack_3830 == 3) {
          *puStack_3830 = ChunkStack[lVar16].ChunkOrder;
        }
        else {
          ChunkStack[lVar16].ChunkOrder = *puStack_3830;
        }
      }
      else {
        ChunkDims3Ext.field_0.field_0.Y = ChunkDims3Ext.field_0.field_0.Y + -1;
        local_1118 = &ChunkStack[lVar16].ChunkFrom3.field_0.field_0.Y;
        local_1120 = &ChunkStack[lVar16].PrevOrder;
        local_10fc = *local_1118 - (int)*local_1120;
        local_1100 = ChunkStack[lVar16].ChunkFrom3.field_0.field_0.Z -
                     *(int *)((long)&ChunkStack[lVar16].PrevOrder + 4);
        local_3838 = ChunkStack[lVar16].ChunkTo3.field_0.field_0.X -
                     ChunkStack[lVar16].ChunkFrom3.field_0.field_0.X;
        local_10f8 = &local_1110;
        local_1110._0_4_ = local_10fc;
        local_1110._4_4_ = local_1100;
        local_1130 = local_1110;
        local_3840 = local_1110;
        uVar7 = local_3840;
        local_1308 = &local_3840;
        local_130c = 1;
        local_3840._0_4_ = (int)local_1110;
        bVar18 = false;
        if ((int)local_3840 == 1) {
          local_3840._4_4_ = (int)((ulong)local_1110 >> 0x20);
          bVar18 = false;
          if (local_3840._4_4_ == 1) {
            bVar18 = local_3838 == 1;
          }
        }
        local_3840 = uVar7;
        local_1128 = local_3838;
        local_1104 = local_3838;
        if (bVar18) {
          local_50c0 = (brick_traverse *)((long)&BrickDims3Ext.field_0.field_4.YZ.field_0 + 4);
          do {
            brick_traverse::brick_traverse(local_50c0);
            local_50c0 = local_50c0 + 1;
          } while (local_50c0 != (brick_traverse *)&Stack[0x3f].Address);
          BrickDims3Ext.field_0.field_0.Y = 0;
          local_15b8 = &Idx2->BricksPerChunk3s;
          local_15bc = (int)Level_00;
          if (0xf < local_15bc) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                         );
          }
          local_1670 = (long)local_15b8->Arr[local_15bc].field_0.field_0.X;
          if (local_1670 == 0) {
            local_1668 = 1;
          }
          else {
            local_30 = local_1670 - 1;
            local_31 = 0xff;
            if (local_30 == 0) {
              local_50d9 = -1;
            }
            else {
              lVar16 = 0x3f;
              if (local_30 != 0) {
                for (; local_30 >> lVar16 == 0; lVar16 = lVar16 + -1) {
                }
              }
              local_50d9 = '?' - ((byte)lVar16 ^ 0x3f);
            }
            local_1668 = 1L << (local_50d9 + 1U & 0x3f);
          }
          iVar13 = (int)local_1668;
          local_15c8 = &Idx2->BricksPerChunk3s;
          local_15cc = (int)Level_00;
          if (0xf < local_15cc) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                         );
          }
          local_1680 = (long)local_15c8->Arr[local_15cc].field_0.field_0.Y;
          if (local_1680 == 0) {
            local_1678 = 1;
          }
          else {
            local_20 = local_1680 - 1;
            local_21 = 0xff;
            if (local_20 == 0) {
              local_50ed = -1;
            }
            else {
              lVar16 = 0x3f;
              if (local_20 != 0) {
                for (; local_20 >> lVar16 == 0; lVar16 = lVar16 + -1) {
                }
              }
              local_50ed = '?' - ((byte)lVar16 ^ 0x3f);
            }
            local_1678 = 1L << (local_50ed + 1U & 0x3f);
          }
          iVar14 = (int)local_1678;
          local_15d8 = &Idx2->BricksPerChunk3s;
          local_15dc = (int)Level_00;
          if (0xf < local_15dc) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                         );
          }
          local_1690 = (long)local_15d8->Arr[local_15dc].field_0.field_0.Z;
          if (local_1690 == 0) {
            local_1688 = 1;
          }
          else {
            local_10 = local_1690 - 1;
            local_11 = 0xff;
            if (local_10 == 0) {
              local_50fd = -1;
            }
            else {
              lVar16 = 0x3f;
              if (local_10 != 0) {
                for (; local_10 >> lVar16 == 0; lVar16 = lVar16 + -1) {
                }
              }
              local_50fd = '?' - ((byte)lVar16 ^ 0x3f);
            }
            local_1688 = 1L << (local_50fd + 1U & 0x3f);
          }
          local_1448 = &local_4868;
          local_1454 = (int)local_1688;
          local_1428 = &Idx2->BricksOrderInChunk;
          local_142c = (int)Level_00;
          local_1450 = iVar14;
          local_144c = iVar13;
          local_4868 = iVar13;
          local_4864 = iVar14;
          BrickDims3Ext.field_0.field_0.X = local_1454;
          if (0xf < local_142c) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
                         );
          }
          local_48a8 = local_1428->Arr[local_142c];
          local_1438 = &Idx2->BricksOrderInChunk;
          local_143c = (int)Level_00;
          if (0xf < local_143c) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
                         );
          }
          local_48a0 = local_1438->Arr[local_143c];
          puVar15 = puStack_3830 + 2;
          local_15e8 = &Idx2->BricksPerChunk3s;
          local_15ec = (int)Level_00;
          if (0xf < local_15ec) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                         );
          }
          local_1958 = local_15e8->Arr + local_15ec;
          local_14c4 = (int)*puVar15 * (local_1958->field_0).field_0.X;
          local_14c8 = *(int *)((long)puStack_3830 + 0x14) * (local_1958->field_0).field_0.Y;
          local_48b0 = (int)puStack_3830[3] * (local_1958->field_0).field_0.Z;
          local_14c0 = &local_1944;
          local_1944._0_4_ = local_14c4;
          local_1944._4_4_ = local_14c8;
          local_1968 = local_1944;
          local_48b8 = local_1944;
          local_4898 = local_1944;
          local_15f8 = &Idx2->BricksPerChunk3s;
          local_15fc = (int)Level_00;
          local_1960 = local_48b0;
          local_1950 = puVar15;
          local_14cc = local_48b0;
          local_4890 = local_48b0;
          if (0xf < local_15fc) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                         );
          }
          local_1988 = local_15f8->Arr + local_15fc;
          local_14ac = (int)puStack_3830[2] * (local_1988->field_0).field_0.X;
          local_14b0 = *(int *)((long)puStack_3830 + 0x14) * (local_1988->field_0).field_0.Y;
          local_48d0 = (int)puStack_3830[3] * (local_1988->field_0).field_0.Z;
          local_14a8 = &local_1974;
          local_1974._0_4_ = local_14ac;
          local_1974._4_4_ = local_14b0;
          local_1998 = local_1974;
          local_48d8 = local_1974;
          local_48c8 = local_1974;
          uVar7 = local_48c8;
          local_13c8 = &local_48c8;
          local_13d0 = &local_4868;
          local_48c8._0_4_ = (int)local_1974;
          local_48c8._4_4_ = (int)((ulong)local_1974 >> 0x20);
          local_13ac = (int)local_48c8 + iVar13;
          local_13b0 = local_48c8._4_4_ + iVar14;
          local_48e0 = local_48d0 + local_1454;
          local_13a8 = &local_13c0;
          local_13c0._0_4_ = local_13ac;
          local_13c0._4_4_ = local_13b0;
          local_13e0 = local_13c0;
          Top = local_13c0;
          local_488c = local_13c0;
          local_4880 = 0;
          local_4878 = 0;
          local_4870 = 0;
          local_48c8 = uVar7;
          local_48c0 = local_48d0;
          local_1990 = local_48d0;
          local_1980 = puStack_3830 + 2;
          local_14b4 = local_48d0;
          local_13d8 = local_48e0;
          local_13b4 = local_48e0;
          local_4884 = local_48e0;
          memcpy((void *)((long)&BrickDims3Ext.field_0 + 8),&local_48a8,0x40);
          while (-1 < BrickDims3Ext.field_0.field_0.Y) {
            lVar16 = (long)BrickDims3Ext.field_0.field_0.Y;
            puStack_48f0 = (ulong *)((long)&BrickDims3Ext + lVar16 * 0x40 + 8);
            local_48f4 = (uint)*puStack_48f0 & 3;
            *puStack_48f0 = *puStack_48f0 >> 2;
            if (local_48f4 == 3) {
              if (*puStack_48f0 == 3) {
                *puStack_48f0 = Stack[lVar16].BrickOrder;
              }
              else {
                Stack[lVar16].BrickOrder = *puStack_48f0;
              }
            }
            else {
              BrickDims3Ext.field_0.field_0.Y = BrickDims3Ext.field_0.field_0.Y + -1;
              local_1158 = &Stack[lVar16].BrickFrom3.field_0.field_0.Y;
              local_1160 = &Stack[lVar16].PrevOrder;
              local_113c = *local_1158 - (int)*local_1160;
              local_1140 = Stack[lVar16].BrickFrom3.field_0.field_0.Z -
                           *(int *)((long)&Stack[lVar16].PrevOrder + 4);
              local_48f8 = Stack[lVar16].BrickTo3.field_0.field_0.X -
                           Stack[lVar16].BrickFrom3.field_0.field_0.X;
              local_1138 = &local_1150;
              local_1150._0_4_ = local_113c;
              local_1150._4_4_ = local_1140;
              local_1170 = local_1150;
              BrickExtent.Dims = local_1150;
              local_4900 = local_1150;
              uVar11 = local_4900;
              local_1318 = &local_4900;
              local_131c = 1;
              local_4900._0_4_ = (int)local_1150;
              bVar18 = false;
              if ((int)local_4900 == 1) {
                local_4900._4_4_ = (int)(local_1150 >> 0x20);
                bVar18 = false;
                if (local_4900._4_4_ == 1) {
                  bVar18 = local_48f8 == 1;
                }
              }
              local_4900 = uVar11;
              local_1168 = local_48f8;
              local_1144 = local_48f8;
              if (bVar18) {
                uVar17 = local_1a7c & 0xffffffff;
                local_1494 = (int)Stack[lVar16].PrevOrder * (uint)local_1a7c;
                local_1498 = *(int *)((long)&Stack[lVar16].PrevOrder + 4) * local_1a7c._4_4_;
                local_4924 = Stack[lVar16].BrickFrom3.field_0.field_0.X * B3.field_0.field_0.X;
                local_1490 = &local_19a4;
                local_19a4._0_4_ = local_1494;
                local_19a4._4_4_ = local_1498;
                local_492c = local_19a4;
                uVar7 = local_492c;
                local_17c0 = local_4920;
                local_17c8 = &local_492c;
                local_17d0 = &local_1a7c;
                local_492c._0_4_ = (uint)local_19a4;
                local_492c._4_4_ = (uint)((ulong)local_19a4 >> 0x20);
                local_4920 = (undefined1  [8])
                             ((long)(int)((uint)local_492c & 0x1fffff) +
                              (long)(int)(local_492c._4_4_ & 0x1fffff) * 0x200000 +
                             ((long)(int)(local_4924 & 0x1fffff) << 0x2a));
                BrickExtent.From =
                     (long)(int)((uint)local_1a7c & 0x1fffff) +
                     (long)(int)(local_1a7c._4_4_ & 0x1fffff) * 0x200000 +
                     ((long)(int)(B3.field_0.field_0.X & 0x1fffff) << 0x2a);
                local_492c = uVar7;
                local_149c = local_4924;
                local_a8 = local_17d0;
                local_a0 = local_17c8;
                Crop<idx2::extent,idx2::extent>((extent *)local_4920,&P->DecodeExtent);
                std::unique_lock<std::mutex>::unique_lock
                          ((unique_lock<std::mutex> *)&First_3.BrickInChunk,&D->Mutex);
                D->NTasks = D->NTasks + 1;
                std::unique_lock<std::mutex>::~unique_lock
                          ((unique_lock<std::mutex> *)&First_3.BrickInChunk);
                decode_state::decode_state((decode_state *)local_49c0);
                First_3.Brick._0_4_ = (undefined4)puStack_48f0[6];
                First_3.ParentBrick._56_8_ = puStack_48f0[2];
                First_3.Brick3.field_0.field_0.X = (int)puStack_48f0[3];
                Brick3.field_0.field_0.Y = 0;
                Brick3.field_0.field_0.X = (uint)puStack_48f0[3];
                Brick3.field_0._8_4_ = (undefined4)uVar17;
                First_3.Brick._4_1_ = Level_00;
                First_3._72_8_ =
                     GetLinearBrick((idx2 *)Idx2,(idx2_file *)(ulong)(uint)(int)Level_00,
                                    (int)puStack_48f0[2],Brick3);
                memcpy(&First_2.Address,local_49c0,0x5e);
                BS::thread_pool::
                push_task<idx2::TraverseFirstLevel(idx2::idx2_file_const&,idx2::params_const&,idx2::decode_data*,idx2::grid_const&,idx2::mmap_volume*,idx2::volume*)::__0>
                          (&D->ThreadPool,(anon_class_160_8_ae9ac49c_for__M_f *)&First_2.Address);
              }
              else {
                memcpy(&Second_2.Address,puStack_48f0,0x40);
                memcpy(&Skip_2.Dims,puStack_48f0,0x40);
                uVar7 = First_2.BrickTo3.field_0.field_4.YZ.field_0;
                local_f38 = puStack_48f0 + 2;
                local_f3c = local_48f4;
                if (2 < (int)local_48f4) {
                  __assert_fail("Idx < 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
                }
                local_f48 = (long)puStack_48f0 + 0x1c;
                local_f4c = local_48f4;
                if (2 < (int)local_48f4) {
                  __assert_fail("Idx < 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
                }
                local_f58 = puStack_48f0 + 2;
                local_f5c = local_48f4;
                if (2 < (int)local_48f4) {
                  __assert_fail("Idx < 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
                }
                local_f68 = (undefined1 *)((long)&First_2.BrickFrom3.field_0 + 4);
                local_f6c = local_48f4;
                if (2 < (int)local_48f4) {
                  __assert_fail("Idx < 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
                }
                *(int *)(local_f68 + (long)(int)local_48f4 * 4) =
                     *(int *)((long)local_f38 + (long)(int)local_48f4 * 4) +
                     (*(int *)(local_f48 + (long)(int)local_48f4 * 4) -
                     *(int *)((long)local_f58 + (long)(int)local_48f4 * 4)) / 2;
                local_f78 = puStack_48f0 + 2;
                local_f7c = local_48f4;
                if (2 < (int)local_48f4) {
                  __assert_fail("Idx < 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
                }
                local_f88 = (long)puStack_48f0 + 0x1c;
                local_f8c = local_48f4;
                if (2 < (int)local_48f4) {
                  __assert_fail("Idx < 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
                }
                local_f98 = puStack_48f0 + 2;
                local_f9c = local_48f4;
                if (2 < (int)local_48f4) {
                  __assert_fail("Idx < 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
                }
                local_fa8 = &Second_2.PrevOrder;
                local_fac = local_48f4;
                if (2 < (int)local_48f4) {
                  __assert_fail("Idx < 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
                }
                *(int *)((long)local_fa8 + (long)(int)local_48f4 * 4) =
                     *(int *)((long)local_f78 + (long)(int)local_48f4 * 4) +
                     (*(int *)(local_f88 + (long)(int)local_48f4 * 4) -
                     *(int *)((long)local_f98 + (long)(int)local_48f4 * 4)) / 2;
                puVar1 = &First_2.PrevOrder;
                puVar2 = (undefined1 *)((long)&First_2.BrickFrom3.field_0 + 4);
                local_117c = First_2.BrickFrom3.field_0.field_0.Y - (uint)First_2.PrevOrder;
                local_1180 = First_2.BrickFrom3.field_0.field_0.Z - First_2.PrevOrder._4_4_;
                local_4b28 = First_2.BrickTo3.field_0.field_0.X - First_2.BrickFrom3.field_0._0_4_;
                local_1178 = &local_1190;
                local_1190._0_4_ = local_117c;
                local_1190._4_4_ = local_1180;
                local_11b0 = local_1190;
                local_4b30 = local_1190;
                local_4b20 = local_1190;
                uVar9 = local_4b20;
                local_17b8 = &local_4b20;
                local_4b10 = (undefined1  [8])
                             ((ulong)((uint)First_2.PrevOrder & 0x1fffff) |
                              (ulong)(First_2.PrevOrder._4_4_ & 0x1fffff) << 0x15 |
                             (ulong)(First_2.BrickFrom3.field_0.field_0.X & 0x1fffff) << 0x2a);
                local_4b20._0_4_ = (uint)local_1190;
                local_4b20._4_4_ = (uint)((ulong)local_1190 >> 0x20);
                Skip_2.From = (ulong)((uint)local_4b20 & 0x1fffff) |
                              (ulong)(local_4b20._4_4_ & 0x1fffff) << 0x15 |
                              (ulong)(local_4b18 & 0x1fffff) << 0x2a;
                puVar3 = &ExtentInChunks.Dims;
                local_4b20 = uVar9;
                local_4b18 = local_4b28;
                local_17b0 = puVar1;
                local_17a8 = (extent *)local_4b10;
                local_11a8 = local_4b28;
                local_11a0 = puVar1;
                local_1198 = puVar2;
                local_1184 = local_4b28;
                local_b8 = local_17b8;
                local_b0 = puVar1;
                local_4b68 = Crop<idx2::extent,idx2::extent>((extent *)local_4b10,(extent *)puVar3);
                iVar13 = (int)First_2.NBricksBefore;
                local_16a8 = &local_4b68;
                local_1a8 = local_4b68.Dims;
                local_18c = ((int)local_4b68.Dims << 0xb) >> 0xb;
                local_188 = &local_1a0;
                local_190 = (int)((long)(local_4b68.Dims << 0x16) >> 0x2b);
                local_4b70 = (int)((long)(local_4b68.Dims * 2) >> 0x2b);
                local_1a0._0_4_ = local_18c;
                local_1a0._4_4_ = local_190;
                local_1b8 = local_1a0;
                local_16b8 = local_1a0;
                local_16a0 = local_1a0;
                local_16c8 = local_1a0;
                local_4b78 = local_1a0;
                local_4b58 = local_1a0;
                uVar9 = local_4b58;
                local_f10 = &local_4b48;
                local_f08 = &local_4b58;
                local_4b58._0_4_ = (int)local_1a0;
                local_4b48 = (long)(int)local_4b58;
                local_4b58._4_4_ = (int)((ulong)local_1a0 >> 0x20);
                local_4b40 = (long)local_4b58._4_4_;
                local_4b38 = (long)local_4b50;
                Second_2.BrickTo3.field_0.field_4.YZ.field_0 =
                     (v2<int>)(uVar7 + local_4b48 * local_4b40 * local_4b38);
                local_4b58 = uVar9;
                local_4b50 = local_4b70;
                local_16c0 = local_4b70;
                local_16b0 = local_4b70;
                local_1698 = local_4b70;
                local_f00 = local_f10;
                local_1b0 = local_4b70;
                local_194 = local_4b70;
                local_4b98 = Crop<idx2::extent,idx2::extent>
                                       ((extent *)local_4b10,(extent *)&VolExtentInChunks.Dims);
                local_16e0 = &local_4b98;
                local_170 = local_4b98.Dims;
                local_154 = ((int)local_4b98.Dims << 0xb) >> 0xb;
                local_150 = &local_168;
                local_158 = (int)((long)(local_4b98.Dims << 0x16) >> 0x2b);
                local_4ba0 = (int)((long)(local_4b98.Dims * 2) >> 0x2b);
                local_168._0_4_ = local_154;
                local_168._4_4_ = local_158;
                local_180 = local_168;
                local_16f0 = local_168;
                local_16d8 = local_168;
                local_1700 = local_168;
                local_4ba8 = local_168;
                local_4b88 = local_168;
                uVar10 = local_4b88;
                local_eb0 = &local_4b88;
                local_4b88._0_4_ = (int)local_168;
                local_4b88._4_4_ = (int)((ulong)local_168 >> 0x20);
                Second_2.NBricksBefore._0_4_ =
                     iVar13 + (int)local_4b88 * local_4b88._4_4_ * local_4ba0;
                First_2._48_8_ = puStack_48f0[7];
                local_11bc = First_2.BrickFrom3.field_0.field_0.Y - (uint)First_2.PrevOrder;
                local_11c0 = First_2.BrickFrom3.field_0.field_0.Z - First_2.PrevOrder._4_4_;
                local_4bd8 = First_2.BrickTo3.field_0.field_0.X - First_2.BrickFrom3.field_0._0_4_;
                local_11b8 = &local_11d0;
                local_11d0._0_4_ = local_11bc;
                local_11d0._4_4_ = local_11c0;
                local_11f0 = local_11d0;
                local_4be0 = local_11d0;
                local_4bd0 = local_11d0;
                uVar9 = local_4bd0;
                local_f18 = &local_4bc0;
                local_ef8 = &local_4bd0;
                local_4bd0._0_4_ = (int)local_11d0;
                local_4bc0 = (long)(int)local_4bd0;
                local_4bd0._4_4_ = (int)((ulong)local_11d0 >> 0x20);
                local_4bb8 = (long)local_4bd0._4_4_;
                local_4bb0 = (long)local_4bc8;
                Second_2._48_8_ = puStack_48f0[7] + local_4bc0 * local_4bb8 * local_4bb0;
                local_df0 = &Second_2.PrevOrder;
                local_330 = ExtentInChunks.Dims;
                local_314 = ((int)ExtentInChunks.Dims << 0xb) >> 0xb;
                local_310 = &local_328;
                local_318 = (int)((long)(ExtentInChunks.Dims << 0x16) >> 0x2b);
                local_8f0 = (int)((long)(ExtentInChunks.Dims * 2) >> 0x2b);
                local_328._0_4_ = local_314;
                local_328._4_4_ = local_318;
                local_340 = local_328;
                local_838 = local_328;
                local_820 = local_328;
                local_848 = local_328;
                local_8f8 = local_328;
                local_8e8 = local_328;
                uVar12 = local_8e8;
                local_2dc = ((int)ExtentInBricks.From << 0xb) >> 0xb;
                local_2d8 = &local_2f0;
                local_2e0 = (int)((long)(ExtentInBricks.From << 0x16) >> 0x2b);
                local_910 = (int)((long)(ExtentInBricks.From * 2) >> 0x2b);
                local_2f0._0_4_ = local_2dc;
                local_2f0._4_4_ = local_2e0;
                local_308 = local_2f0;
                local_8b0 = local_2f0;
                local_898 = local_2f0;
                local_8c0 = local_2f0;
                local_918 = local_2f0;
                local_908 = local_2f0;
                uVar6 = local_908;
                local_870 = &local_8e8;
                local_878 = &local_908;
                local_8e8._0_4_ = (int)local_328;
                local_8e8._4_4_ = (int)((ulong)local_328 >> 0x20);
                local_908._0_4_ = (int)local_2f0;
                local_908._4_4_ = (int)((ulong)local_2f0 >> 0x20);
                local_854 = (int)local_8e8 + (int)local_908;
                local_858 = local_8e8._4_4_ + local_908._4_4_;
                local_4bf8 = local_8f0 + local_910;
                local_850 = &local_868;
                local_868._0_4_ = local_854;
                local_868._4_4_ = local_858;
                local_888 = local_868;
                local_928 = local_868;
                local_8d0 = local_868;
                local_938 = local_868;
                local_4c00 = local_868;
                local_4bec = local_868;
                uVar7 = local_4bec;
                local_df8 = &local_4bec;
                local_4bec._0_4_ = (int)local_868;
                bVar18 = false;
                if ((int)Second_2.PrevOrder < (int)local_4bec) {
                  local_4bec._4_4_ = (int)((ulong)local_868 >> 0x20);
                  bVar18 = false;
                  if (Second_2.PrevOrder._4_4_ < local_4bec._4_4_) {
                    bVar18 = Second_2.BrickFrom3.field_0.field_0.X < local_4bf8;
                  }
                }
                bVar4 = false;
                if (bVar18) {
                  local_5c0 = &ExtentInChunks.Dims;
                  local_598 = ExtentInChunks.Dims;
                  local_57c = ((int)ExtentInChunks.Dims << 0xb) >> 0xb;
                  local_578 = &local_590;
                  local_580 = (int)((long)(ExtentInChunks.Dims << 0x16) >> 0x2b);
                  local_4c18 = (int)((long)(ExtentInChunks.Dims * 2) >> 0x2b);
                  local_590._0_4_ = local_57c;
                  local_590._4_4_ = local_580;
                  local_5a8 = local_590;
                  local_5d0 = local_590;
                  local_5b8 = local_590;
                  local_5e0 = local_590;
                  local_4c20 = local_590;
                  local_4c0c = local_590;
                  uVar8 = local_4c0c;
                  local_e08 = (undefined1 *)((long)&Second_2.BrickFrom3.field_0 + 4);
                  local_e00 = &local_4c0c;
                  local_4c0c._0_4_ = (int)local_590;
                  bVar4 = false;
                  bVar18 = (int)local_4c0c < Second_2.BrickFrom3.field_0.field_0.Y;
                  local_4c0c = uVar8;
                  local_4c04 = local_4c18;
                  local_5d8 = local_4c18;
                  local_5c8 = local_4c18;
                  local_5b0 = local_4c18;
                  local_5a0 = local_4c18;
                  local_584 = local_4c18;
                  if (bVar18) {
                    local_4c0c._4_4_ = (int)((ulong)local_590 >> 0x20);
                    bVar4 = false;
                    bVar18 = local_4c0c._4_4_ < Second_2.BrickFrom3.field_0.field_0.Z;
                    if (bVar18) {
                      bVar4 = local_4c18 < Second_2.BrickTo3.field_0.field_0.X;
                    }
                  }
                }
                local_4bec = uVar7;
                local_4be4 = local_4bf8;
                local_4bd0 = uVar9;
                local_4bc8 = local_4bd8;
                local_4b88 = uVar10;
                local_4b80 = local_4ba0;
                local_16f8 = local_4ba0;
                local_16e8 = local_4ba0;
                local_16d0 = local_4ba0;
                local_11e8 = local_4bd8;
                local_11e0 = puVar1;
                local_11d8 = puVar2;
                local_11c4 = local_4bd8;
                local_ef0 = local_f18;
                local_930 = local_4bf8;
                local_920 = local_4bf8;
                local_908 = uVar6;
                local_900 = local_910;
                local_8e8 = uVar12;
                local_8e0 = local_8f0;
                local_8d8 = puVar3;
                local_8c8 = local_4bf8;
                local_8b8 = local_910;
                local_8a8 = local_910;
                local_8a0 = puVar3;
                local_890 = local_910;
                local_880 = local_4bf8;
                local_85c = local_4bf8;
                local_840 = local_8f0;
                local_830 = local_8f0;
                local_828 = puVar3;
                local_818 = local_8f0;
                local_338 = local_8f0;
                local_31c = local_8f0;
                local_300 = local_910;
                local_2e4 = local_910;
                local_178 = local_4ba0;
                local_15c = local_4ba0;
                if (bVar4) {
                  BrickDims3Ext.field_0.field_0.Y = BrickDims3Ext.field_0.field_0.Y + 1;
                  memcpy((void *)((long)&BrickDims3Ext +
                                 (long)BrickDims3Ext.field_0.field_0.Y * 0x40 + 8),&Skip_2.Dims,0x40
                        );
                }
                local_e10 = &First_2.PrevOrder;
                local_9c8 = &ExtentInChunks.Dims;
                local_368 = ExtentInChunks.Dims;
                local_34c = ((int)ExtentInChunks.Dims << 0xb) >> 0xb;
                local_348 = &local_360;
                local_350 = (int)((long)(ExtentInChunks.Dims << 0x16) >> 0x2b);
                local_9e0 = (int)((long)(ExtentInChunks.Dims * 2) >> 0x2b);
                local_360._0_4_ = local_34c;
                local_360._4_4_ = local_350;
                local_378 = local_360;
                local_800 = local_360;
                local_7e8 = local_360;
                local_810 = local_360;
                local_9e8 = local_360;
                local_9d8 = local_360;
                uVar10 = local_9d8;
                local_2a4 = ((int)ExtentInBricks.From << 0xb) >> 0xb;
                local_2a0 = &local_2b8;
                local_2a8 = (int)((long)(ExtentInBricks.From << 0x16) >> 0x2b);
                local_a00 = (int)((long)(ExtentInBricks.From * 2) >> 0x2b);
                local_2b8._0_4_ = local_2a4;
                local_2b8._4_4_ = local_2a8;
                local_2d0 = local_2b8;
                local_9a0 = local_2b8;
                local_988 = local_2b8;
                local_9b0 = local_2b8;
                local_a08 = local_2b8;
                local_9f8 = local_2b8;
                uVar9 = local_9f8;
                local_960 = &local_9d8;
                local_968 = &local_9f8;
                local_9d8._0_4_ = (int)local_360;
                local_9d8._4_4_ = (int)((ulong)local_360 >> 0x20);
                local_9f8._0_4_ = (int)local_2b8;
                local_9f8._4_4_ = (int)((ulong)local_2b8 >> 0x20);
                local_944 = (int)local_9d8 + (int)local_9f8;
                local_948 = local_9d8._4_4_ + local_9f8._4_4_;
                local_4c38 = local_9e0 + local_a00;
                local_940 = &local_958;
                local_958._0_4_ = local_944;
                local_958._4_4_ = local_948;
                local_978 = local_958;
                local_a18 = local_958;
                local_9c0 = local_958;
                local_a28 = local_958;
                local_4c40 = local_958;
                local_4c2c = local_958;
                uVar7 = local_4c2c;
                local_e18 = &local_4c2c;
                local_4c2c._0_4_ = (int)local_958;
                bVar18 = false;
                if ((int)(uint)First_2.PrevOrder < (int)local_4c2c) {
                  local_4c2c._4_4_ = (int)((ulong)local_958 >> 0x20);
                  bVar18 = false;
                  if ((int)First_2.PrevOrder._4_4_ < local_4c2c._4_4_) {
                    bVar18 = First_2.BrickFrom3.field_0.field_0.X < local_4c38;
                  }
                }
                bVar4 = false;
                if (bVar18) {
                  local_5f8 = &ExtentInChunks.Dims;
                  local_560 = ExtentInChunks.Dims;
                  local_544 = ((int)ExtentInChunks.Dims << 0xb) >> 0xb;
                  local_540 = &local_558;
                  local_548 = (int)((long)(ExtentInChunks.Dims << 0x16) >> 0x2b);
                  local_4c44 = (int)((long)(ExtentInChunks.Dims * 2) >> 0x2b);
                  local_558._0_4_ = local_544;
                  local_558._4_4_ = local_548;
                  local_570 = local_558;
                  local_608 = local_558;
                  local_5f0 = local_558;
                  local_618 = local_558;
                  First_1.Address = local_558;
                  local_4c4c = local_558;
                  uVar11 = local_4c4c;
                  local_e28 = (undefined1 *)((long)&First_2.BrickFrom3.field_0 + 4);
                  local_e20 = &local_4c4c;
                  local_4c4c._0_4_ = (int)local_558;
                  bVar4 = false;
                  bVar18 = (int)local_4c4c < First_2.BrickFrom3.field_0.field_0.Y;
                  local_4c4c = uVar11;
                  local_610 = local_4c44;
                  local_600 = local_4c44;
                  local_5e8 = local_4c44;
                  local_568 = local_4c44;
                  local_54c = local_4c44;
                  if (bVar18) {
                    local_4c4c._4_4_ = (int)(local_558 >> 0x20);
                    bVar4 = false;
                    bVar18 = local_4c4c._4_4_ < First_2.BrickFrom3.field_0.field_0.Z;
                    if (bVar18) {
                      bVar4 = local_4c44 < First_2.BrickTo3.field_0.field_0.X;
                    }
                  }
                }
                local_4c2c = uVar7;
                local_4c24 = local_4c38;
                local_a20 = local_4c38;
                local_a10 = local_4c38;
                local_9f8 = uVar9;
                local_9f0 = local_a00;
                local_9d8 = uVar10;
                local_9d0 = local_9e0;
                local_9b8 = local_4c38;
                local_9a8 = local_a00;
                local_998 = local_a00;
                local_990 = local_9c8;
                local_980 = local_a00;
                local_970 = local_4c38;
                local_94c = local_4c38;
                local_808 = local_9e0;
                local_7f8 = local_9e0;
                local_7f0 = local_9c8;
                local_7e0 = local_9e0;
                local_370 = local_9e0;
                local_354 = local_9e0;
                local_2c8 = local_a00;
                local_2ac = local_a00;
                if (bVar4) {
                  BrickDims3Ext.field_0.field_0.Y = BrickDims3Ext.field_0.field_0.Y + 1;
                  memcpy((void *)((long)&BrickDims3Ext +
                                 (long)BrickDims3Ext.field_0.field_0.Y * 0x40 + 8),&Second_2.Address
                         ,0x40);
                }
              }
            }
          }
        }
        else {
          memcpy(&Second_1.Address,puStack_3830,0x40);
          memcpy(&Skip_1.Dims,puStack_3830,0x40);
          uVar7 = First_1.ChunkTo3.field_0.field_4.YZ.field_0;
          local_fb8 = puStack_3830 + 2;
          local_fbc = local_3834;
          if (2 < (int)local_3834) {
            __assert_fail("Idx < 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
          }
          local_fc8 = (long)puStack_3830 + 0x1c;
          local_fcc = local_3834;
          if (2 < (int)local_3834) {
            __assert_fail("Idx < 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
          }
          local_fd8 = puStack_3830 + 2;
          local_fdc = local_3834;
          if (2 < (int)local_3834) {
            __assert_fail("Idx < 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
          }
          local_fe8 = (undefined1 *)((long)&First_1.ChunkFrom3.field_0 + 4);
          local_fec = local_3834;
          if (2 < (int)local_3834) {
            __assert_fail("Idx < 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
          }
          *(int *)(local_fe8 + (long)(int)local_3834 * 4) =
               *(int *)((long)local_fb8 + (long)(int)local_3834 * 4) +
               (*(int *)(local_fc8 + (long)(int)local_3834 * 4) -
               *(int *)((long)local_fd8 + (long)(int)local_3834 * 4)) / 2;
          local_ff8 = puStack_3830 + 2;
          local_ffc = local_3834;
          if (2 < (int)local_3834) {
            __assert_fail("Idx < 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
          }
          local_1008 = (long)puStack_3830 + 0x1c;
          local_100c = local_3834;
          if (2 < (int)local_3834) {
            __assert_fail("Idx < 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
          }
          local_1018 = puStack_3830 + 2;
          local_101c = local_3834;
          if (2 < (int)local_3834) {
            __assert_fail("Idx < 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
          }
          local_1028 = &Second_1.PrevOrder;
          local_102c = local_3834;
          if (2 < (int)local_3834) {
            __assert_fail("Idx < 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
          }
          *(int *)((long)local_1028 + (long)(int)local_3834 * 4) =
               *(int *)((long)local_ff8 + (long)(int)local_3834 * 4) +
               (*(int *)(local_1008 + (long)(int)local_3834 * 4) -
               *(int *)((long)local_1018 + (long)(int)local_3834 * 4)) / 2;
          puVar1 = &First_1.PrevOrder;
          puVar2 = (undefined1 *)((long)&First_1.ChunkFrom3.field_0 + 4);
          local_11fc = First_1.ChunkFrom3.field_0.field_0.Y - (uint)First_1.PrevOrder;
          local_1200 = First_1.ChunkFrom3.field_0.field_0.Z - First_1.PrevOrder._4_4_;
          local_4d08 = First_1.ChunkTo3.field_0.field_0.X - First_1.ChunkFrom3.field_0._0_4_;
          local_11f8 = &local_1210;
          local_1210._0_4_ = local_11fc;
          local_1210._4_4_ = local_1200;
          local_1230 = local_1210;
          local_4d10 = local_1210;
          local_4d00 = local_1210;
          uVar9 = local_4d00;
          local_17a0 = &local_4d00;
          local_4cf0 = (undefined1  [8])
                       ((ulong)((uint)First_1.PrevOrder & 0x1fffff) |
                        (ulong)(First_1.PrevOrder._4_4_ & 0x1fffff) << 0x15 |
                       (ulong)(First_1.ChunkFrom3.field_0.field_0.X & 0x1fffff) << 0x2a);
          local_4d00._0_4_ = (uint)local_1210;
          local_4d00._4_4_ = (uint)((ulong)local_1210 >> 0x20);
          Skip_1.From = (ulong)((uint)local_4d00 & 0x1fffff) |
                        (ulong)(local_4d00._4_4_ & 0x1fffff) << 0x15 |
                        (ulong)(local_4cf8 & 0x1fffff) << 0x2a;
          puVar3 = &ExtentInFiles.Dims;
          local_4d00 = uVar9;
          local_4cf8 = local_4d08;
          local_1798 = puVar1;
          local_1790 = (extent *)local_4cf0;
          local_1228 = local_4d08;
          local_1220 = puVar1;
          local_1218 = puVar2;
          local_1204 = local_4d08;
          local_c8 = local_17a0;
          local_c0 = puVar1;
          local_4d48 = Crop<idx2::extent,idx2::extent>((extent *)local_4cf0,(extent *)puVar3);
          iVar13 = (int)First_1.NChunksBefore;
          local_1718 = &local_4d48;
          local_138 = local_4d48.Dims;
          local_11c = ((int)local_4d48.Dims << 0xb) >> 0xb;
          local_118 = &local_130;
          local_120 = (int)((long)(local_4d48.Dims << 0x16) >> 0x2b);
          local_4d50 = (int)((long)(local_4d48.Dims * 2) >> 0x2b);
          local_130._0_4_ = local_11c;
          local_130._4_4_ = local_120;
          local_148 = local_130;
          local_1728 = local_130;
          local_1710 = local_130;
          local_1738 = local_130;
          local_4d58 = local_130;
          local_4d38 = local_130;
          uVar9 = local_4d38;
          local_f20 = &local_4d28;
          local_ee8 = &local_4d38;
          local_4d38._0_4_ = (int)local_130;
          local_4d28 = (long)(int)local_4d38;
          local_4d38._4_4_ = (int)((ulong)local_130 >> 0x20);
          local_4d20 = (long)local_4d38._4_4_;
          local_4d18 = (long)local_4d30;
          Second_1.ChunkTo3.field_0.field_4.YZ.field_0 =
               (v2<int>)(uVar7 + local_4d28 * local_4d20 * local_4d18);
          local_4d38 = uVar9;
          local_4d30 = local_4d50;
          local_1730 = local_4d50;
          local_1720 = local_4d50;
          local_1708 = local_4d50;
          local_ee0 = local_f20;
          local_140 = local_4d50;
          local_124 = local_4d50;
          local_4d78 = Crop<idx2::extent,idx2::extent>
                                 ((extent *)local_4cf0,(extent *)&VolExtentInFiles.Dims);
          local_1750 = &local_4d78;
          local_100 = local_4d78.Dims;
          local_e4 = ((int)local_4d78.Dims << 0xb) >> 0xb;
          local_e0 = &local_f8;
          local_e8 = (int)((long)(local_4d78.Dims << 0x16) >> 0x2b);
          local_4d80 = (int)((long)(local_4d78.Dims * 2) >> 0x2b);
          local_f8._0_4_ = local_e4;
          local_f8._4_4_ = local_e8;
          local_110 = local_f8;
          local_1760 = local_f8;
          local_1748 = local_f8;
          local_1770 = local_f8;
          local_4d88 = local_f8;
          local_4d68 = local_f8;
          uVar10 = local_4d68;
          local_eb8 = &local_4d68;
          local_4d68._0_4_ = (int)local_f8;
          local_4d68._4_4_ = (int)((ulong)local_f8 >> 0x20);
          Second_1.NChunksBefore._0_4_ = iVar13 + (int)local_4d68 * local_4d68._4_4_ * local_4d80;
          First_1._48_8_ = puStack_3830[7];
          local_123c = First_1.ChunkFrom3.field_0.field_0.Y - (uint)First_1.PrevOrder;
          local_1240 = First_1.ChunkFrom3.field_0.field_0.Z - First_1.PrevOrder._4_4_;
          local_4db8 = First_1.ChunkTo3.field_0.field_0.X - First_1.ChunkFrom3.field_0._0_4_;
          local_1238 = &local_1250;
          local_1250._0_4_ = local_123c;
          local_1250._4_4_ = local_1240;
          local_1270 = local_1250;
          local_4dc0 = local_1250;
          local_4db0 = local_1250;
          uVar9 = local_4db0;
          local_f28 = &local_4da0;
          local_ed8 = &local_4db0;
          local_4db0._0_4_ = (int)local_1250;
          local_4da0 = (long)(int)local_4db0;
          local_4db0._4_4_ = (int)((ulong)local_1250 >> 0x20);
          local_4d98 = (long)local_4db0._4_4_;
          local_4d90 = (long)local_4da8;
          Second_1._48_8_ = puStack_3830[7] + local_4da0 * local_4d98 * local_4d90;
          local_e30 = &Second_1.PrevOrder;
          local_3a0 = ExtentInFiles.Dims;
          local_384 = ((int)ExtentInFiles.Dims << 0xb) >> 0xb;
          local_380 = &local_398;
          local_388 = (int)((long)(ExtentInFiles.Dims << 0x16) >> 0x2b);
          local_ad0 = (int)((long)(ExtentInFiles.Dims * 2) >> 0x2b);
          local_398._0_4_ = local_384;
          local_398._4_4_ = local_388;
          local_3b0 = local_398;
          local_7c8 = local_398;
          local_7b0 = local_398;
          local_7d8 = local_398;
          local_ad8 = local_398;
          local_ac8 = local_398;
          uVar12 = local_ac8;
          local_288 = ExtentInChunks.From;
          local_26c = ((int)ExtentInChunks.From << 0xb) >> 0xb;
          local_268 = &local_280;
          local_270 = (int)((long)(ExtentInChunks.From << 0x16) >> 0x2b);
          local_af0 = (int)((long)(ExtentInChunks.From * 2) >> 0x2b);
          local_280._0_4_ = local_26c;
          local_280._4_4_ = local_270;
          local_298 = local_280;
          local_a90 = local_280;
          local_a78 = local_280;
          local_aa0 = local_280;
          local_af8 = local_280;
          local_ae8 = local_280;
          uVar6 = local_ae8;
          local_a50 = &local_ac8;
          local_a58 = &local_ae8;
          local_ac8._0_4_ = (int)local_398;
          local_ac8._4_4_ = (int)((ulong)local_398 >> 0x20);
          local_ae8._0_4_ = (int)local_280;
          local_ae8._4_4_ = (int)((ulong)local_280 >> 0x20);
          local_a34 = (int)local_ac8 + (int)local_ae8;
          local_a38 = local_ac8._4_4_ + local_ae8._4_4_;
          local_4dd8 = local_ad0 + local_af0;
          local_a30 = &local_a48;
          local_a48._0_4_ = local_a34;
          local_a48._4_4_ = local_a38;
          local_a68 = local_a48;
          local_b08 = local_a48;
          local_ab0 = local_a48;
          local_b18 = local_a48;
          local_4de0 = local_a48;
          local_4dcc = local_a48;
          uVar7 = local_4dcc;
          local_e38 = &local_4dcc;
          local_4dcc._0_4_ = (int)local_a48;
          bVar18 = false;
          if ((int)Second_1.PrevOrder < (int)local_4dcc) {
            local_4dcc._4_4_ = (int)((ulong)local_a48 >> 0x20);
            bVar18 = false;
            if (Second_1.PrevOrder._4_4_ < local_4dcc._4_4_) {
              bVar18 = Second_1.ChunkFrom3.field_0.field_0.X < local_4dd8;
            }
          }
          bVar4 = false;
          if (bVar18) {
            local_630 = &ExtentInFiles.Dims;
            local_528 = ExtentInFiles.Dims;
            local_50c = ((int)ExtentInFiles.Dims << 0xb) >> 0xb;
            local_508 = &local_520;
            local_510 = (int)((long)(ExtentInFiles.Dims << 0x16) >> 0x2b);
            local_4df8 = (int)((long)(ExtentInFiles.Dims * 2) >> 0x2b);
            local_520._0_4_ = local_50c;
            local_520._4_4_ = local_510;
            local_538 = local_520;
            local_640 = local_520;
            local_628 = local_520;
            local_650 = local_520;
            local_4e00 = local_520;
            local_4dec = local_520;
            uVar8 = local_4dec;
            local_e48 = (undefined1 *)((long)&Second_1.ChunkFrom3.field_0 + 4);
            local_e40 = &local_4dec;
            local_4dec._0_4_ = (int)local_520;
            bVar4 = false;
            bVar18 = (int)local_4dec < Second_1.ChunkFrom3.field_0.field_0.Y;
            local_4dec = uVar8;
            local_4de4 = local_4df8;
            local_648 = local_4df8;
            local_638 = local_4df8;
            local_620 = local_4df8;
            local_530 = local_4df8;
            local_514 = local_4df8;
            if (bVar18) {
              local_4dec._4_4_ = (int)((ulong)local_520 >> 0x20);
              bVar4 = false;
              bVar18 = local_4dec._4_4_ < Second_1.ChunkFrom3.field_0.field_0.Z;
              if (bVar18) {
                bVar4 = local_4df8 < Second_1.ChunkTo3.field_0.field_0.X;
              }
            }
          }
          local_4dcc = uVar7;
          local_4dc4 = local_4dd8;
          local_4db0 = uVar9;
          local_4da8 = local_4db8;
          local_4d68 = uVar10;
          local_4d60 = local_4d80;
          local_1768 = local_4d80;
          local_1758 = local_4d80;
          local_1740 = local_4d80;
          local_1268 = local_4db8;
          local_1260 = puVar1;
          local_1258 = puVar2;
          local_1244 = local_4db8;
          local_ed0 = local_f28;
          local_b10 = local_4dd8;
          local_b00 = local_4dd8;
          local_ae8 = uVar6;
          local_ae0 = local_af0;
          local_ac8 = uVar12;
          local_ac0 = local_ad0;
          local_ab8 = puVar3;
          local_aa8 = local_4dd8;
          local_a98 = local_af0;
          local_a88 = local_af0;
          local_a80 = puVar3;
          local_a70 = local_af0;
          local_a60 = local_4dd8;
          local_a3c = local_4dd8;
          local_7d0 = local_ad0;
          local_7c0 = local_ad0;
          local_7b8 = puVar3;
          local_7a8 = local_ad0;
          local_3a8 = local_ad0;
          local_38c = local_ad0;
          local_290 = local_af0;
          local_274 = local_af0;
          local_108 = local_4d80;
          local_ec = local_4d80;
          if (bVar4) {
            ChunkDims3Ext.field_0.field_0.Y = ChunkDims3Ext.field_0.field_0.Y + 1;
            memcpy((void *)((long)&ChunkDims3Ext + (long)ChunkDims3Ext.field_0.field_0.Y * 0x40 + 8)
                   ,&Skip_1.Dims,0x40);
          }
          local_e50 = &First_1.PrevOrder;
          local_ba8 = &ExtentInFiles.Dims;
          local_3d8 = ExtentInFiles.Dims;
          local_3bc = ((int)ExtentInFiles.Dims << 0xb) >> 0xb;
          local_3b8 = &local_3d0;
          local_3c0 = (int)((long)(ExtentInFiles.Dims << 0x16) >> 0x2b);
          local_bc0 = (int)((long)(ExtentInFiles.Dims * 2) >> 0x2b);
          local_3d0._0_4_ = local_3bc;
          local_3d0._4_4_ = local_3c0;
          local_3e8 = local_3d0;
          local_790 = local_3d0;
          local_778 = local_3d0;
          local_7a0 = local_3d0;
          local_bc8 = local_3d0;
          local_bb8 = local_3d0;
          uVar10 = local_bb8;
          local_250 = ExtentInChunks.From;
          local_234 = ((int)ExtentInChunks.From << 0xb) >> 0xb;
          local_230 = &local_248;
          local_238 = (int)((long)(ExtentInChunks.From << 0x16) >> 0x2b);
          local_be0 = (int)((long)(ExtentInChunks.From * 2) >> 0x2b);
          local_248._0_4_ = local_234;
          local_248._4_4_ = local_238;
          local_260 = local_248;
          local_b80 = local_248;
          local_b68 = local_248;
          local_b90 = local_248;
          local_be8 = local_248;
          local_bd8 = local_248;
          uVar9 = local_bd8;
          local_b40 = &local_bb8;
          local_b48 = &local_bd8;
          local_bb8._0_4_ = (int)local_3d0;
          local_bb8._4_4_ = (int)((ulong)local_3d0 >> 0x20);
          local_bd8._0_4_ = (int)local_248;
          local_bd8._4_4_ = (int)((ulong)local_248 >> 0x20);
          local_b24 = (int)local_bb8 + (int)local_bd8;
          local_b28 = local_bb8._4_4_ + local_bd8._4_4_;
          local_4e18 = local_bc0 + local_be0;
          local_b20 = &local_b38;
          local_b38._0_4_ = local_b24;
          local_b38._4_4_ = local_b28;
          local_b58 = local_b38;
          local_bf8 = local_b38;
          local_ba0 = local_b38;
          local_c08 = local_b38;
          local_4e20 = local_b38;
          local_4e0c = local_b38;
          uVar7 = local_4e0c;
          local_e58 = &local_4e0c;
          local_4e0c._0_4_ = (int)local_b38;
          bVar18 = false;
          if ((int)(uint)First_1.PrevOrder < (int)local_4e0c) {
            local_4e0c._4_4_ = (int)((ulong)local_b38 >> 0x20);
            bVar18 = false;
            if ((int)First_1.PrevOrder._4_4_ < local_4e0c._4_4_) {
              bVar18 = First_1.ChunkFrom3.field_0.field_0.X < local_4e18;
            }
          }
          bVar4 = false;
          if (bVar18) {
            local_668 = &ExtentInFiles.Dims;
            local_4f0 = ExtentInFiles.Dims;
            local_4d4 = ((int)ExtentInFiles.Dims << 0xb) >> 0xb;
            local_4d0 = &local_4e8;
            local_4d8 = (int)((long)(ExtentInFiles.Dims << 0x16) >> 0x2b);
            local_4e24 = (int)((long)(ExtentInFiles.Dims * 2) >> 0x2b);
            local_4e8._0_4_ = local_4d4;
            local_4e8._4_4_ = local_4d8;
            local_500 = local_4e8;
            local_678 = local_4e8;
            local_660 = local_4e8;
            local_688 = local_4e8;
            First.Address = local_4e8;
            local_4e2c = local_4e8;
            uVar11 = local_4e2c;
            local_e68 = (undefined1 *)((long)&First_1.ChunkFrom3.field_0 + 4);
            local_e60 = &local_4e2c;
            local_4e2c._0_4_ = (int)local_4e8;
            bVar4 = false;
            bVar18 = (int)local_4e2c < First_1.ChunkFrom3.field_0.field_0.Y;
            local_4e2c = uVar11;
            local_680 = local_4e24;
            local_670 = local_4e24;
            local_658 = local_4e24;
            local_4f8 = local_4e24;
            local_4dc = local_4e24;
            if (bVar18) {
              local_4e2c._4_4_ = (int)(local_4e8 >> 0x20);
              bVar4 = false;
              bVar18 = local_4e2c._4_4_ < First_1.ChunkFrom3.field_0.field_0.Z;
              if (bVar18) {
                bVar4 = local_4e24 < First_1.ChunkTo3.field_0.field_0.X;
              }
            }
          }
          local_4e0c = uVar7;
          local_4e04 = local_4e18;
          local_c00 = local_4e18;
          local_bf0 = local_4e18;
          local_bd8 = uVar9;
          local_bd0 = local_be0;
          local_bb8 = uVar10;
          local_bb0 = local_bc0;
          local_b98 = local_4e18;
          local_b88 = local_be0;
          local_b78 = local_be0;
          local_b70 = local_ba8;
          local_b60 = local_be0;
          local_b50 = local_4e18;
          local_b2c = local_4e18;
          local_798 = local_bc0;
          local_788 = local_bc0;
          local_780 = local_ba8;
          local_770 = local_bc0;
          local_3e0 = local_bc0;
          local_3c4 = local_bc0;
          local_258 = local_be0;
          local_23c = local_be0;
          if (bVar4) {
            ChunkDims3Ext.field_0.field_0.Y = ChunkDims3Ext.field_0.field_0.Y + 1;
            memcpy((void *)((long)&ChunkDims3Ext + (long)ChunkDims3Ext.field_0.field_0.Y * 0x40 + 8)
                   ,&Second_1.Address,0x40);
          }
        }
      }
    }
  } while( true );
}

Assistant:

error<idx2_err_code>
TraverseFirstLevel(const idx2_file& Idx2,
                   const params& P,
                   decode_data* D,
                   const grid& OutGrid,
                   mmap_volume* OutVolFile,
                   volume* OutVolMem)
{
  i8 Level = Idx2.NLevels - 1; // coarsest level
  extent ExtentInBricks, ExtentInChunks, ExtentInFiles;
  extent VolExtentInBricks, VolExtentInChunks, VolExtentInFiles;
  ComputeExtentsForTraversal(Idx2,
                             P.DecodeExtent,
                             Level,
                             &ExtentInBricks,
                             &ExtentInChunks,
                             &ExtentInFiles,
                             &VolExtentInBricks,
                             &VolExtentInChunks,
                             &VolExtentInFiles);
  v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level); // dimension of bricks on this level
  decode_state Ds;
  idx2_FileTraverse(
    idx2_ChunkTraverse(
      idx2_BrickTraverse(
        extent BrickExtent = extent(Top.BrickFrom3 * B3, B3);
        extent BrickExtentCrop = Crop(BrickExtent, P.DecodeExtent);
        {
          std::unique_lock<std::mutex> Lock(D->Mutex);
          ++D->NTasks;
        }
        decode_state First;
        First.BrickInChunk = Top.BrickInChunk;
        First.Level = Level;
        First.Brick3 = Top.BrickFrom3;
        First.Brick = GetLinearBrick(Idx2, Level, Top.BrickFrom3);
        D->ThreadPool.push_task([&, First, BrickExtentCrop]() {
          TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        });
        //auto Task = stlab::async(stlab::default_executor,
        //  [&, First, BrickExtentCrop]()
        //  {
        //    TraverseSecondLevel(Idx2, P, D, First, BrickExtentCrop, OutGrid, OutVolFile, OutVolMem);
        //  });
        //Task.detach();
        ,
        64,
        Idx2.BricksOrderInChunk[Level],
        ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[Level],
        Idx2.BricksPerChunk3s[Level],
        ExtentInBricks,
        VolExtentInBricks);
      ,
      64,
      Idx2.ChunksOrderInFile[Level],
      FileTop.FileFrom3 * Idx2.ChunksPerFile3s[Level],
      Idx2.ChunksPerFile3s[Level],
      ExtentInChunks,
      VolExtentInChunks);
    , 64, Idx2.FilesOrder[Level], v3i(0), Idx2.NFiles3[Level], ExtentInFiles, VolExtentInFiles);

  return idx2_Error(idx2_err_code::NoError);
}